

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

SampledSpectrum __thiscall
pbrt::VolPathIntegrator::Li
          (VolPathIntegrator *this,RayDifferential *ray,SampledWavelengths *lambda,
          SamplerHandle *sampler,ScratchBuffer *scratchBuffer,VisibleSurface *visibleSurf)

{
  Vector3f *this_00;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *pvVar1;
  Transform *this_01;
  int *piVar2;
  DenselySampledSpectrum *pDVar3;
  Normal3f *pNVar4;
  float fVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  BxDFFlags flags;
  undefined4 uVar10;
  undefined4 uVar11;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  TVar12;
  Interval IVar13;
  undefined4 uVar15;
  undefined4 uVar16;
  TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
  *pTVar14;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  anon_class_24_3_20c75c41 func;
  anon_class_24_3_20c75c41 func_00;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  uintptr_t uVar30;
  undefined1 auVar31 [32];
  undefined1 auVar32 [20];
  undefined1 auVar33 [32];
  undefined1 auVar34 [64];
  RayDifferential *pRVar35;
  bool bVar36;
  bool bVar37;
  int iVar38;
  ShapeIntersection *pSVar39;
  uint64_t uVar40;
  uint64_t seed;
  ShapeIntersection *pSVar41;
  BSDFSample *pBVar42;
  BSDFSample *pBVar43;
  BSSRDFProbeSegment *pBVar44;
  int iVar45;
  Float *pFVar46;
  DenselySampledSpectrum *pDVar47;
  float *pfVar48;
  int iVar49;
  ulong uVar50;
  uint uVar51;
  Float *pFVar52;
  DenselySampledSpectrum *this_02;
  int iVar53;
  TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
  *pTVar54;
  int iVar55;
  int iVar56;
  long lVar57;
  int *piVar58;
  int *piVar59;
  LightHandle *light;
  float *pfVar60;
  TaggedPointer<pbrt::HGPhaseFunction> TVar61;
  TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
  *this_03;
  Float *pFVar62;
  long in_FS_OFFSET;
  undefined1 in_ZmmResult [64];
  undefined1 auVar71 [48];
  undefined1 auVar64 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  Float FVar72;
  type tVar73;
  type tVar74;
  Point2f PVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined8 uVar187;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  Interval IVar188;
  undefined1 auVar80 [16];
  undefined1 auVar81 [32];
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar189 [56];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  undefined1 auVar116 [64];
  undefined1 auVar117 [64];
  undefined1 auVar118 [64];
  undefined1 auVar119 [64];
  undefined1 auVar120 [64];
  undefined1 auVar121 [64];
  undefined1 auVar122 [64];
  undefined1 auVar123 [64];
  undefined1 auVar124 [64];
  undefined1 auVar125 [64];
  undefined1 auVar126 [64];
  undefined1 auVar127 [64];
  undefined1 auVar128 [64];
  undefined1 auVar129 [64];
  undefined1 auVar130 [64];
  undefined1 auVar131 [64];
  undefined1 auVar132 [64];
  undefined1 auVar133 [64];
  undefined1 auVar134 [64];
  undefined1 auVar135 [64];
  undefined1 auVar136 [64];
  undefined1 auVar137 [64];
  undefined1 auVar82 [32];
  undefined1 auVar138 [64];
  undefined1 auVar139 [64];
  undefined1 auVar140 [64];
  undefined1 auVar141 [64];
  undefined1 auVar142 [64];
  undefined1 auVar143 [64];
  undefined1 auVar144 [64];
  undefined1 auVar145 [64];
  undefined1 auVar146 [64];
  undefined1 auVar147 [64];
  undefined1 auVar148 [64];
  undefined1 auVar149 [64];
  undefined1 auVar83 [32];
  undefined1 auVar150 [64];
  undefined1 auVar151 [64];
  undefined1 auVar152 [64];
  undefined1 auVar153 [64];
  undefined1 auVar154 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar155 [64];
  undefined1 auVar157 [64];
  undefined1 auVar158 [64];
  undefined1 extraout_var_01 [56];
  undefined1 auVar159 [64];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 extraout_var_02 [56];
  undefined1 auVar161 [64];
  undefined1 auVar162 [64];
  undefined1 auVar163 [64];
  undefined1 extraout_var_03 [56];
  undefined1 auVar165 [64];
  undefined1 auVar166 [64];
  undefined1 auVar167 [64];
  undefined1 auVar168 [64];
  undefined1 auVar169 [64];
  undefined1 auVar170 [64];
  undefined1 auVar171 [64];
  undefined1 auVar172 [64];
  undefined1 auVar173 [64];
  undefined1 auVar174 [64];
  undefined1 extraout_var_05 [56];
  undefined1 auVar176 [64];
  undefined1 auVar177 [64];
  undefined1 extraout_var_06 [56];
  undefined1 auVar178 [64];
  undefined1 auVar179 [64];
  undefined1 auVar180 [64];
  undefined1 extraout_var_07 [56];
  undefined1 auVar181 [64];
  undefined1 auVar182 [64];
  undefined1 auVar183 [64];
  undefined1 auVar184 [64];
  undefined1 extraout_var_08 [56];
  undefined1 auVar185 [64];
  undefined1 auVar190 [16];
  undefined8 uVar292;
  undefined1 auVar191 [16];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [64];
  undefined1 auVar199 [64];
  undefined1 auVar200 [64];
  undefined1 auVar201 [64];
  undefined1 auVar202 [64];
  undefined1 auVar203 [64];
  undefined1 auVar291 [60];
  undefined1 auVar205 [64];
  undefined1 auVar206 [64];
  undefined1 auVar207 [64];
  undefined1 auVar208 [64];
  undefined1 auVar209 [64];
  undefined1 auVar210 [64];
  undefined1 auVar211 [64];
  undefined1 auVar212 [64];
  undefined1 auVar213 [64];
  undefined1 auVar214 [64];
  undefined1 auVar215 [64];
  undefined1 auVar216 [64];
  undefined1 auVar217 [64];
  undefined1 auVar218 [64];
  undefined1 auVar219 [64];
  undefined1 auVar220 [64];
  undefined1 auVar221 [64];
  undefined1 auVar222 [64];
  undefined1 auVar223 [64];
  undefined1 auVar224 [64];
  undefined1 auVar225 [64];
  undefined1 auVar226 [64];
  undefined1 auVar227 [64];
  undefined1 auVar228 [64];
  undefined1 auVar229 [64];
  undefined1 auVar230 [64];
  undefined1 auVar232 [64];
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  undefined1 auVar249 [64];
  undefined1 auVar250 [64];
  undefined1 auVar251 [64];
  undefined1 auVar252 [64];
  undefined1 auVar253 [64];
  undefined1 auVar254 [64];
  undefined1 auVar255 [64];
  undefined1 auVar256 [64];
  undefined1 auVar257 [64];
  undefined1 auVar258 [64];
  undefined1 auVar259 [64];
  undefined1 auVar260 [64];
  undefined1 auVar261 [64];
  undefined1 auVar262 [64];
  undefined1 auVar263 [64];
  undefined1 auVar264 [64];
  undefined1 auVar265 [64];
  undefined1 auVar266 [64];
  undefined1 auVar267 [64];
  undefined1 auVar268 [64];
  undefined1 auVar269 [64];
  undefined1 auVar270 [64];
  undefined1 auVar271 [64];
  undefined1 auVar272 [64];
  undefined1 auVar274 [64];
  undefined1 auVar275 [64];
  undefined1 auVar276 [64];
  undefined1 auVar277 [64];
  undefined1 auVar278 [64];
  undefined1 auVar279 [64];
  undefined1 auVar280 [64];
  undefined1 auVar281 [64];
  undefined1 auVar283 [64];
  undefined1 auVar284 [64];
  undefined1 auVar285 [64];
  undefined1 auVar286 [64];
  undefined1 auVar287 [64];
  undefined1 auVar288 [64];
  undefined1 auVar289 [64];
  undefined1 auVar290 [64];
  float fVar294;
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  float fVar301;
  undefined1 auVar304 [12];
  undefined1 in_ZMM4 [64];
  undefined1 auVar303 [64];
  float fVar305;
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar316 [12];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 in_ZMM6 [64];
  undefined1 auVar315 [64];
  float fVar317;
  undefined1 auVar322 [12];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 in_ZMM7 [64];
  undefined1 auVar321 [64];
  anon_class_16_2_d8f97178 func_01;
  anon_class_16_2_2793a994 func_02;
  anon_class_16_2_d8f97178 func_03;
  Vector3<float> VVar323;
  Vector3<float> VVar324;
  Point3f PVar325;
  Point3f p;
  Point3<float> PVar326;
  Vector3f woRender;
  Vector3f woRender_00;
  Vector3f wi;
  Vector3f woRender_01;
  SampledSpectrum SVar327;
  SampledSpectrum SVar328;
  SampledSpectrum a;
  SampledSpectrum a_00;
  SampledSpectrum a_01;
  SampledSpectrum a_02;
  SampledSpectrum a_03;
  anon_class_16_2_a5d7db33 func_04;
  bool specularBounce;
  bool anyNonSpecularBounces;
  bool terminated;
  bool scattered;
  undefined1 local_7c8 [16];
  SampledWavelengths *local_7b8;
  float local_7ac;
  undefined1 local_7a8 [16];
  Float tMax;
  undefined1 local_788 [24];
  int depth;
  Float tMin;
  RayDifferential *local_768;
  TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
  *local_760;
  int voxel [3];
  Float nextCrossingT [3];
  SampledSpectrum d;
  BSSRDFHandle bssrdf;
  Interval local_718;
  float local_710;
  float local_708;
  float fStack_704;
  undefined1 auStack_700 [8];
  SampledSpectrum T_hat;
  SampledSpectrum uniPathPDF;
  float local_6cc;
  int voxelLimit [3];
  int step [3];
  Float deltaT [3];
  BSSRDFSample bssrdfSample;
  SampledSpectrum sigma_maj;
  bool local_628;
  SampledSpectrum rho;
  SampledSpectrum *local_610;
  Interval local_608;
  Interval IStack_600;
  Interval IStack_5f8;
  SampledSpectrum *pSStack_5f0;
  SampledWavelengths *pSStack_5e8;
  RNG *pRStack_5e0;
  TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
  *pTStack_5d8;
  RayDifferential *pRStack_5d0;
  SampledSpectrum L;
  SampledSpectrum Le;
  float fStack_588;
  SampledSpectrum lightPathPDF;
  optional<pbrt::BSDFSample> bs;
  RNG rng;
  SampledSpectrum rrBeta;
  undefined4 uStack_4a8;
  undefined4 uStack_4a4;
  undefined4 uStack_4a0;
  undefined4 uStack_49c;
  undefined4 uStack_498;
  undefined4 uStack_494;
  undefined4 uStack_490;
  undefined1 uStack_48c;
  undefined4 uStack_488;
  undefined4 uStack_484;
  undefined4 uStack_480;
  undefined4 uStack_47c;
  undefined4 local_478;
  undefined4 uStack_474;
  undefined8 local_470;
  undefined8 local_468;
  undefined4 local_460;
  undefined8 local_440;
  Normal3<float> aNStack_438 [10];
  bool local_3b8;
  LightSampleContext prevIntrContext;
  SampledSpectrum sigma_a_3;
  float fStack_360;
  float fStack_354;
  float local_350;
  float fStack_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  undefined8 uStack_338;
  undefined1 auStack_330 [20];
  SampledSpectrum TmajAccum;
  Interval IStack_2f8;
  Float FStack_2f0;
  undefined1 auStack_2ec [32];
  undefined4 uStack_2cc;
  BSDF bsdf;
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  float fStack_210;
  float fStack_20c;
  TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_1f0;
  undefined1 local_1e8 [8];
  TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_1e0;
  uintptr_t local_1d8;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_1d0;
  TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  local_1c8;
  LightHandle local_1c0;
  SampledSpectrum sigma_t;
  bool local_18c;
  ulong uStack_180;
  SampledSpectrum Tmaj;
  optional<pbrt::ShapeIntersection> si;
  undefined1 auVar329 [28];
  undefined1 auVar63 [16];
  undefined1 auVar65 [64];
  undefined1 auVar68 [64];
  undefined1 auVar92 [64];
  undefined1 auVar156 [64];
  undefined1 auVar160 [64];
  undefined1 auVar164 [64];
  undefined1 auVar175 [64];
  undefined1 auVar186 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_04 [56];
  undefined1 auVar204 [64];
  undefined1 auVar231 [64];
  undefined1 auVar233 [64];
  undefined1 auVar273 [64];
  undefined1 auVar282 [64];
  undefined1 auVar293 [56];
  float fVar302;
  
  local_7b8 = lambda;
  local_760 = (TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
               *)sampler;
  SampledSpectrum::SampledSpectrum(&L,0.0);
  SampledSpectrum::SampledSpectrum(&T_hat,1.0);
  SampledSpectrum::SampledSpectrum(&uniPathPDF,1.0);
  SampledSpectrum::SampledSpectrum(&lightPathPDF,1.0);
  auVar198 = ZEXT464(0x3f800000);
  bVar37 = false;
  specularBounce = false;
  depth = 0;
  this_00 = &(ray->super_Ray).d;
  prevIntrContext.ns.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
  prevIntrContext.ns.super_Tuple3<pbrt::Normal3,_float>.z = 0.0;
  prevIntrContext.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low =
       0.0;
  prevIntrContext.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high
       = 0.0;
  prevIntrContext.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low =
       0.0;
  prevIntrContext.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high
       = 0.0;
  prevIntrContext.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low =
       0.0;
  prevIntrContext.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high
       = 0.0;
  prevIntrContext._24_16_ = ZEXT816(0);
  local_6cc = 1.0;
  local_768 = ray;
  do {
    pRVar35 = local_768;
    auVar153 = ZEXT1664(SUB6416(ZEXT464(0x7f800000),0));
    auVar198 = ZEXT1664(auVar198._0_16_);
    auVar303 = ZEXT1664(in_ZMM4._0_16_);
    auVar315 = ZEXT1664(in_ZMM6._0_16_);
    auVar321 = ZEXT1664(in_ZMM7._0_16_);
    Integrator::Intersect(&si,(Integrator *)this,&local_768->super_Ray,INFINITY);
    if (((pRVar35->super_Ray).medium.
         super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
         .bits & 0xffffffffffff) == 0) {
LAB_003cd303:
      auVar189 = auVar198._8_56_;
      auVar293 = auVar153._8_56_;
      if (si.set == false) {
        this_03 = (TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
                   *)(this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.
                     infiniteLights.
                     super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                     _M_impl.super__Vector_impl_data._M_start;
        pTVar14 = *(TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
                    **)((long)&(this->super_RayIntegrator).super_ImageTileIntegrator.
                               super_Integrator.infiniteLights.
                               super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>
                               ._M_impl.super__Vector_impl_data + 8);
        while( true ) {
          auVar189 = auVar198._8_56_;
          auVar293 = auVar153._8_56_;
          if (this_03 == pTVar14) break;
          func_02.lambda = local_7b8;
          func_02.ray = &local_768->super_Ray;
          SVar327 = TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
                    ::
                    Dispatch<pbrt::LightHandle::Le(pbrt::Ray_const&,pbrt::SampledWavelengths_const&)const::_lambda(auto:1)_1_>
                              (this_03,func_02);
          auVar198._0_8_ = SVar327.values.values._8_8_;
          auVar198._8_56_ = auVar189;
          auVar179._0_8_ = SVar327.values.values._0_8_;
          auVar179._8_56_ = auVar293;
          auVar190 = vmovlhps_avx(auVar179._0_16_,auVar198._0_16_);
          auVar153 = ZEXT1664(auVar190);
          Le.values.values._0_8_ = auVar190._0_8_;
          Le.values.values[2] = auVar190._8_4_;
          Le.values.values[3] = auVar190._12_4_;
          bVar37 = SampledSpectrum::operator_cast_to_bool(&Le);
          auVar189 = auVar198._8_56_;
          auVar293 = auVar153._8_56_;
          if (bVar37) {
            if ((depth == 0) || (specularBounce == true)) {
              SVar327 = SampledSpectrum::operator*(&T_hat,&Le);
              auVar286._0_8_ = SVar327.values.values._8_8_;
              auVar286._8_56_ = auVar189;
              auVar180._0_8_ = SVar327.values.values._0_8_;
              auVar180._8_56_ = auVar293;
              local_788._0_16_ = auVar180._0_16_;
              local_7c8 = auVar286._0_16_;
              FVar72 = SampledSpectrum::Average(&uniPathPDF);
              local_7a8._0_4_ = FVar72;
              auVar293 = extraout_var_07;
              SVar327 = SampledWavelengths::PDF(local_7b8);
              auVar287._0_8_ = SVar327.values.values._8_8_;
              auVar287._8_56_ = auVar189;
              auVar181._0_8_ = SVar327.values.values._0_8_;
              auVar181._8_56_ = auVar293;
              rho.values.values = (array<float,_4>)vmovlhps_avx(auVar181._0_16_,auVar287._0_16_);
              SVar327 = SampledSpectrum::operator*(&rho,(Float)local_7a8._0_4_);
              auVar297 = local_788._0_16_;
              auVar190 = local_7c8;
              SVar328.values.values[2] = (float)local_7c8._0_4_;
              SVar328.values.values[3] = (float)local_7c8._4_4_;
              SVar328.values.values[0] = (float)local_788._0_4_;
              SVar328.values.values[1] = (float)local_788._4_4_;
              auVar189 = ZEXT856((ulong)local_7c8._8_8_);
              auVar293 = ZEXT856((ulong)local_788._8_8_);
              local_7c8 = auVar190;
              local_788._0_16_ = auVar297;
              SVar327 = SafeDiv(SVar328,SVar327);
              auVar198._0_8_ = SVar327.values.values._8_8_;
              auVar198._8_56_ = auVar189;
              auVar182._0_8_ = SVar327.values.values._0_8_;
              auVar182._8_56_ = auVar293;
              auVar190 = auVar182._0_16_;
            }
            else {
              local_1c0.
              super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
              .bits = *(TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                        *)this_03;
              func_03.light = &local_1c0;
              func_03.ctx = &prevIntrContext;
              FVar72 = TaggedPointer<pbrt::UniformLightSampler,pbrt::PowerLightSampler,pbrt::BVHLightSampler,pbrt::ExhaustiveLightSampler>
                       ::
                       Dispatch<pbrt::LightSamplerHandle::PDF(pbrt::LightSampleContext_const&,pbrt::LightHandle)const::_lambda(auto:1)_1_>
                                 ((TaggedPointer<pbrt::UniformLightSampler,pbrt::PowerLightSampler,pbrt::BVHLightSampler,pbrt::ExhaustiveLightSampler>
                                   *)&this->lightSampler,func_03);
              local_788._0_4_ = FVar72;
              rrBeta.values.values[0] =
                   prevIntrContext.pi.super_Point3<pbrt::Interval>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
              rrBeta.values.values[1] =
                   prevIntrContext.pi.super_Point3<pbrt::Interval>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
              rrBeta.values.values[2] =
                   prevIntrContext.pi.super_Point3<pbrt::Interval>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
              rrBeta.values.values[3] =
                   prevIntrContext.pi.super_Point3<pbrt::Interval>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
              bssrdfSample.Sp.values.values[0] =
                   (local_768->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
              bssrdfSample.Sp.values.values[1] =
                   (local_768->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
              bssrdfSample.Sp.values.values[2] =
                   (local_768->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
              sigma_a_3.values.values[0] = 0.0;
              rho.values.values._8_8_ = &bssrdfSample;
              rho.values.values._0_8_ = (optional<pbrt::ShapeIntersection> *)&rrBeta;
              auVar189 = (undefined1  [56])0x0;
              func_00.wi = (Vector3f *)&bssrdfSample;
              func_00.ctx = (LightSampleContext *)&rrBeta;
              func_00.mode = (LightSamplingMode *)&sigma_a_3;
              FVar72 = TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
                       ::
                       Dispatch<pbrt::LightHandle::PDF_Li(pbrt::LightSampleContext,pbrt::Vector3<float>,pbrt::LightSamplingMode)const::_lambda(auto:1)_1_>
                                 (this_03,func_00);
              auVar293 = (undefined1  [56])0x0;
              SampledSpectrum::operator*=(&lightPathPDF,FVar72 * (float)local_788._0_4_);
              SVar327 = SampledSpectrum::operator*(&T_hat,&Le);
              auVar288._0_8_ = SVar327.values.values._8_8_;
              auVar288._8_56_ = auVar189;
              auVar183._0_8_ = SVar327.values.values._0_8_;
              auVar183._8_56_ = auVar293;
              local_788._0_16_ = auVar183._0_16_;
              local_7c8 = auVar288._0_16_;
              SVar327 = SampledSpectrum::operator+(&uniPathPDF,&lightPathPDF);
              auVar289._0_8_ = SVar327.values.values._8_8_;
              auVar289._8_56_ = auVar189;
              auVar184._0_8_ = SVar327.values.values._0_8_;
              auVar184._8_56_ = auVar293;
              rho.values.values = (array<float,_4>)vmovlhps_avx(auVar184._0_16_,auVar289._0_16_);
              FVar72 = SampledSpectrum::Average(&rho);
              local_7a8._0_4_ = FVar72;
              auVar293 = extraout_var_08;
              SVar327 = SampledWavelengths::PDF(local_7b8);
              auVar290._0_8_ = SVar327.values.values._8_8_;
              auVar290._8_56_ = auVar189;
              auVar185._0_8_ = SVar327.values.values._0_8_;
              auVar185._8_56_ = auVar293;
              auVar190 = vmovlhps_avx(auVar185._0_16_,auVar290._0_16_);
              bssrdfSample.Sp.values.values._0_8_ = auVar190._0_8_;
              bssrdfSample.Sp.values.values[2] = auVar190._8_4_;
              bssrdfSample.Sp.values.values[3] = auVar190._12_4_;
              SVar327 = SampledSpectrum::operator*(&bssrdfSample.Sp,(Float)local_7a8._0_4_);
              auVar297 = local_788._0_16_;
              auVar190 = local_7c8;
              a_03.values.values[2] = (float)local_7c8._0_4_;
              a_03.values.values[3] = (float)local_7c8._4_4_;
              a_03.values.values[0] = (float)local_788._0_4_;
              a_03.values.values[1] = (float)local_788._4_4_;
              auVar189 = ZEXT856((ulong)local_7c8._8_8_);
              auVar293 = ZEXT856((ulong)local_788._8_8_);
              local_7c8 = auVar190;
              local_788._0_16_ = auVar297;
              SVar327 = SafeDiv(a_03,SVar327);
              auVar198._0_8_ = SVar327.values.values._8_8_;
              auVar198._8_56_ = auVar189;
              auVar186._0_8_ = SVar327.values.values._0_8_;
              auVar186._8_56_ = auVar293;
              auVar190 = auVar186._0_16_;
            }
            auVar190 = vmovlhps_avx(auVar190,auVar198._0_16_);
            auVar153 = ZEXT1664(auVar190);
            rrBeta.values.values._0_8_ = auVar190._0_8_;
            rrBeta.values.values[2] = auVar190._8_4_;
            rrBeta.values.values[3] = auVar190._12_4_;
            SampledSpectrum::operator+=(&L,&rrBeta);
          }
          this_03 = this_03 + 8;
        }
        pstd::optional<pbrt::ShapeIntersection>::~optional(&si);
        return (SampledSpectrum)L.values;
      }
      pSVar39 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
      VVar323 = Tuple3<pbrt::Vector3,_float>::operator-
                          (&this_00->super_Tuple3<pbrt::Vector3,_float>);
      SVar327 = SurfaceInteraction::Le
                          (&pSVar39->intr,(Vector3f)VVar323.super_Tuple3<pbrt::Vector3,_float>,
                           local_7b8);
      auVar270._0_8_ = SVar327.values.values._8_8_;
      auVar270._8_56_ = auVar189;
      auVar154._0_8_ = SVar327.values.values._0_8_;
      auVar154._8_56_ = auVar293;
      auVar190 = vmovlhps_avx(auVar154._0_16_,auVar270._0_16_);
      uVar187 = auVar190._8_8_;
      Le.values.values._0_8_ = auVar190._0_8_;
      Le.values.values[2] = auVar190._8_4_;
      Le.values.values[3] = auVar190._12_4_;
      bVar36 = SampledSpectrum::operator_cast_to_bool(&Le);
      auVar296 = auVar321._0_16_;
      auVar297 = auVar315._0_16_;
      auVar190 = auVar303._0_16_;
      auVar293 = auVar270._8_56_;
      if (bVar36) {
        if ((depth == 0) || (specularBounce == true)) {
          SVar327 = SampledSpectrum::operator*(&T_hat,&Le);
          auVar265._0_8_ = SVar327.values.values._8_8_;
          auVar265._8_56_ = auVar293;
          local_788._8_8_ = uVar187;
          local_788._0_8_ = SVar327.values.values._0_8_;
          local_7c8 = auVar265._0_16_;
          FVar72 = SampledSpectrum::Average(&uniPathPDF);
          local_7a8._0_4_ = FVar72;
          auVar189 = extraout_var_00;
          SVar327 = SampledWavelengths::PDF(local_7b8);
          auVar266._0_8_ = SVar327.values.values._8_8_;
          auVar266._8_56_ = auVar293;
          auVar155._0_8_ = SVar327.values.values._0_8_;
          auVar155._8_56_ = auVar189;
          rho.values.values = (array<float,_4>)vmovlhps_avx(auVar155._0_16_,auVar266._0_16_);
          SVar327 = SampledSpectrum::operator*(&rho,(Float)local_7a8._0_4_);
          auVar297 = local_788._0_16_;
          auVar190 = local_7c8;
          a.values.values[2] = (float)local_7c8._0_4_;
          a.values.values[3] = (float)local_7c8._4_4_;
          a.values.values[0] = (float)local_788._0_4_;
          a.values.values[1] = (float)local_788._4_4_;
          auVar189 = ZEXT856((ulong)local_7c8._8_8_);
          auVar293 = ZEXT856((ulong)local_788._8_8_);
          local_7c8 = auVar190;
          local_788._0_16_ = auVar297;
          SVar327 = SafeDiv(a,SVar327);
          auVar270._0_8_ = SVar327.values.values._8_8_;
          auVar270._8_56_ = auVar189;
          auVar156._0_8_ = SVar327.values.values._0_8_;
          auVar156._8_56_ = auVar293;
          auVar190 = auVar156._0_16_;
        }
        else {
          local_1c8.bits =
               (pSVar39->intr).areaLight.
               super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
               .bits;
          sigma_a_3.values.values[0] = (float)local_1c8.bits;
          sigma_a_3.values.values[1] = (float)(local_1c8.bits >> 0x20);
          func_01.light = (LightHandle *)&local_1c8;
          func_01.ctx = &prevIntrContext;
          FVar72 = TaggedPointer<pbrt::UniformLightSampler,pbrt::PowerLightSampler,pbrt::BVHLightSampler,pbrt::ExhaustiveLightSampler>
                   ::
                   Dispatch<pbrt::LightSamplerHandle::PDF(pbrt::LightSampleContext_const&,pbrt::LightHandle)const::_lambda(auto:1)_1_>
                             ((TaggedPointer<pbrt::UniformLightSampler,pbrt::PowerLightSampler,pbrt::BVHLightSampler,pbrt::ExhaustiveLightSampler>
                               *)&this->lightSampler,func_01);
          local_788._0_4_ = FVar72;
          uStack_498 = prevIntrContext.n.super_Tuple3<pbrt::Normal3,_float>.z;
          uStack_494 = prevIntrContext.ns.super_Tuple3<pbrt::Normal3,_float>.x;
          uStack_490 = prevIntrContext.ns.super_Tuple3<pbrt::Normal3,_float>.y;
          _uStack_48c = prevIntrContext.ns.super_Tuple3<pbrt::Normal3,_float>.z;
          rrBeta.values.values[0] =
               prevIntrContext.pi.super_Point3<pbrt::Interval>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
          rrBeta.values.values[1] =
               prevIntrContext.pi.super_Point3<pbrt::Interval>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
          rrBeta.values.values[2] =
               prevIntrContext.pi.super_Point3<pbrt::Interval>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
          rrBeta.values.values[3] =
               prevIntrContext.pi.super_Point3<pbrt::Interval>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
          uStack_4a8 = prevIntrContext.pi.super_Point3<pbrt::Interval>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low;
          uStack_4a4 = prevIntrContext.pi.super_Point3<pbrt::Interval>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high;
          uStack_4a0 = prevIntrContext.n.super_Tuple3<pbrt::Normal3,_float>.x;
          uStack_49c = prevIntrContext.n.super_Tuple3<pbrt::Normal3,_float>.y;
          bssrdfSample.Sp.values.values[0] =
               (local_768->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
          bssrdfSample.Sp.values.values[1] =
               (local_768->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
          bssrdfSample.Sp.values.values[2] =
               (local_768->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar34._60_4_ = 0;
          auVar34._0_60_ = stack0xfffffffffffffcfc;
          _TmajAccum = auVar34 << 0x20;
          local_610 = &TmajAccum;
          rho.values.values._8_8_ = &bssrdfSample;
          rho.values.values._0_8_ = (optional<pbrt::ShapeIntersection> *)&rrBeta;
          auVar189 = (undefined1  [56])0x0;
          auVar303 = ZEXT1664(auVar190);
          auVar315 = ZEXT1664(auVar297);
          auVar321 = ZEXT1664(auVar296);
          func.wi = (Vector3f *)&bssrdfSample;
          func.ctx = (LightSampleContext *)&rrBeta;
          func.mode = (LightSamplingMode *)local_610;
          FVar72 = TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
                   ::
                   Dispatch<pbrt::LightHandle::PDF_Li(pbrt::LightSampleContext,pbrt::Vector3<float>,pbrt::LightSamplingMode)const::_lambda(auto:1)_1_>
                             ((TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
                               *)&sigma_a_3,func);
          auVar293 = (undefined1  [56])0x0;
          SampledSpectrum::operator*=(&lightPathPDF,FVar72 * (float)local_788._0_4_);
          SVar327 = SampledSpectrum::operator*(&T_hat,&Le);
          auVar267._0_8_ = SVar327.values.values._8_8_;
          auVar267._8_56_ = auVar189;
          auVar157._0_8_ = SVar327.values.values._0_8_;
          auVar157._8_56_ = auVar293;
          local_788._0_16_ = auVar157._0_16_;
          local_7c8 = auVar267._0_16_;
          SVar327 = SampledSpectrum::operator+(&uniPathPDF,&lightPathPDF);
          auVar268._0_8_ = SVar327.values.values._8_8_;
          auVar268._8_56_ = auVar189;
          auVar158._0_8_ = SVar327.values.values._0_8_;
          auVar158._8_56_ = auVar293;
          rho.values.values = (array<float,_4>)vmovlhps_avx(auVar158._0_16_,auVar268._0_16_);
          FVar72 = SampledSpectrum::Average(&rho);
          local_7a8._0_4_ = FVar72;
          auVar293 = extraout_var_01;
          SVar327 = SampledWavelengths::PDF(local_7b8);
          auVar269._0_8_ = SVar327.values.values._8_8_;
          auVar269._8_56_ = auVar189;
          auVar159._0_8_ = SVar327.values.values._0_8_;
          auVar159._8_56_ = auVar293;
          auVar190 = vmovlhps_avx(auVar159._0_16_,auVar269._0_16_);
          bssrdfSample.Sp.values.values._0_8_ = auVar190._0_8_;
          bssrdfSample.Sp.values.values[2] = auVar190._8_4_;
          bssrdfSample.Sp.values.values[3] = auVar190._12_4_;
          SVar327 = SampledSpectrum::operator*(&bssrdfSample.Sp,(Float)local_7a8._0_4_);
          auVar297 = local_788._0_16_;
          auVar190 = local_7c8;
          a_00.values.values[2] = (float)local_7c8._0_4_;
          a_00.values.values[3] = (float)local_7c8._4_4_;
          a_00.values.values[0] = (float)local_788._0_4_;
          a_00.values.values[1] = (float)local_788._4_4_;
          auVar189 = ZEXT856((ulong)local_7c8._8_8_);
          auVar293 = ZEXT856((ulong)local_788._8_8_);
          local_7c8 = auVar190;
          local_788._0_16_ = auVar297;
          SVar327 = SafeDiv(a_00,SVar327);
          auVar270._0_8_ = SVar327.values.values._8_8_;
          auVar270._8_56_ = auVar189;
          auVar160._0_8_ = SVar327.values.values._0_8_;
          auVar160._8_56_ = auVar293;
          auVar190 = auVar160._0_16_;
        }
        auVar190 = vmovlhps_avx(auVar190,auVar270._0_16_);
        uVar187 = auVar190._8_8_;
        rrBeta.values.values._0_8_ = auVar190._0_8_;
        rrBeta.values.values[2] = auVar190._8_4_;
        rrBeta.values.values[3] = auVar190._12_4_;
        SampledSpectrum::operator+=(&L,&rrBeta);
      }
      local_1d0.bits =
           (this->super_RayIntegrator).super_ImageTileIntegrator.camera.
           super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
           .bits;
      local_1d8 = *(uintptr_t *)local_760;
      SurfaceInteraction::GetBSDF
                (&bsdf,&pSVar39->intr,local_768,local_7b8,(CameraHandle *)&local_1d0,scratchBuffer,
                 (SamplerHandle)&local_1d8);
      auVar63 = auVar321._0_16_;
      auVar296 = auVar315._0_16_;
      auVar297 = auVar303._0_16_;
      auVar190 = auVar270._0_16_;
      if (((undefined1  [16])bsdf._0_16_ & (undefined1  [16])0xffffffffffff) ==
          (undefined1  [16])0x0) {
        pSVar41 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
        SurfaceInteraction::SkipIntersection(&pSVar39->intr,local_768,pSVar41->tHit);
        uVar51 = 0;
      }
      else {
        if (depth == 0 && visibleSurf != (VisibleSurface *)0x0) {
          SampledSpectrum::SampledSpectrum(&rho,0.0);
          uVar40 = 1;
          while( true ) {
            auVar63 = auVar321._0_16_;
            auVar296 = auVar315._0_16_;
            auVar297 = auVar303._0_16_;
            auVar293 = auVar270._8_56_;
            if (uVar40 == 0x11) break;
            FVar72 = RadicalInverse(0,uVar40);
            local_788._0_4_ = FVar72;
            local_7c8._0_4_ = RadicalInverse(1,uVar40);
            local_7c8._4_4_ = extraout_XMM0_Db;
            local_7c8._8_4_ = extraout_XMM0_Dc;
            local_7c8._12_4_ = extraout_XMM0_Dd;
            local_7a8._0_4_ = RadicalInverse(2,uVar40);
            local_7a8._4_4_ = extraout_XMM0_Db_00;
            local_7a8._8_4_ = extraout_XMM0_Dc_00;
            local_7a8._12_4_ = extraout_XMM0_Dd_00;
            pSVar41 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
            auVar190 = vinsertps_avx(local_7c8,ZEXT416((uint)local_7a8._0_4_),0x10);
            auVar270 = ZEXT6064((undefined1  [60])0x0) << 0x20;
            BSDF::Sample_f((optional<pbrt::BSDFSample> *)&rrBeta,&bsdf,
                           (Vector3f)
                           (pSVar41->intr).super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>,
                           (Float)local_788._0_4_,(Point2f)auVar190._0_8_,Radiance,All);
            auVar293 = auVar270._8_56_;
            if (uStack_48c == '\x01') {
              pBVar42 = pstd::optional<pbrt::BSDFSample>::value
                                  ((optional<pbrt::BSDFSample> *)&rrBeta);
              pBVar43 = pstd::optional<pbrt::BSDFSample>::value
                                  ((optional<pbrt::BSDFSample> *)&rrBeta);
              pSVar41 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
              tVar74 = AbsDot<float>(&pBVar43->wi,&(pSVar41->intr).shading.n);
              auVar189 = extraout_var_02;
              SVar327 = SampledSpectrum::operator*(&pBVar42->f,tVar74);
              auVar271._0_8_ = SVar327.values.values._8_8_;
              auVar271._8_56_ = auVar293;
              auVar161._0_8_ = SVar327.values.values._0_8_;
              auVar161._8_56_ = auVar189;
              auVar190 = vmovlhps_avx(auVar161._0_16_,auVar271._0_16_);
              bssrdfSample.Sp.values.values._0_8_ = auVar190._0_8_;
              bssrdfSample.Sp.values.values[2] = auVar190._8_4_;
              bssrdfSample.Sp.values.values[3] = auVar190._12_4_;
              pBVar42 = pstd::optional<pbrt::BSDFSample>::value
                                  ((optional<pbrt::BSDFSample> *)&rrBeta);
              auVar189 = (undefined1  [56])0x0;
              SVar327 = SampledSpectrum::operator/(&bssrdfSample.Sp,pBVar42->pdf);
              auVar270._0_8_ = SVar327.values.values._8_8_;
              auVar270._8_56_ = auVar293;
              auVar162._0_8_ = SVar327.values.values._0_8_;
              auVar162._8_56_ = auVar189;
              auVar190 = vmovlhps_avx(auVar162._0_16_,auVar270._0_16_);
              Le.values.values._0_8_ = auVar190._0_8_;
              Le.values.values[2] = auVar190._8_4_;
              Le.values.values[3] = auVar190._12_4_;
              SampledSpectrum::operator+=(&rho,&Le);
            }
            pstd::optional<pbrt::BSDFSample>::~optional((optional<pbrt::BSDFSample> *)&rrBeta);
            uVar40 = uVar40 + 1;
          }
          auVar189 = (undefined1  [56])0x0;
          SVar327 = SampledSpectrum::operator/(&rho,16.0);
          auVar272._0_8_ = SVar327.values.values._8_8_;
          auVar272._8_56_ = auVar293;
          auVar163._0_8_ = SVar327.values.values._0_8_;
          auVar163._8_56_ = auVar189;
          auVar190 = auVar272._0_16_;
          auVar308 = vmovlhps_avx(auVar163._0_16_,auVar190);
          Le.values.values._0_8_ = auVar308._0_8_;
          Le.values.values[2] = auVar308._8_4_;
          Le.values.values[3] = auVar308._12_4_;
          pSVar41 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
          VisibleSurface::VisibleSurface
                    ((VisibleSurface *)&rrBeta,&pSVar41->intr,
                     (CameraTransform *)
                     ((this->super_RayIntegrator).super_ImageTileIntegrator.camera.
                      super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                      .bits & 0xffffffffffff),&Le,local_7b8);
          (visibleSurf->albedo).values.values[3] = (float)local_478;
          auVar28._8_4_ = rrBeta.values.values[2];
          auVar28._0_4_ = rrBeta.values.values[0];
          auVar28._4_4_ = rrBeta.values.values[1];
          auVar28._12_4_ = rrBeta.values.values[3];
          uVar22 = uStack_4a8;
          auVar21 = auVar28;
          auVar329._16_4_ = uVar22;
          auVar329._0_16_ = auVar21;
          uVar23 = uStack_4a4;
          auVar329._20_4_ = uVar23;
          uVar24 = uStack_4a0;
          auVar329._24_4_ = uVar24;
          uVar25 = uStack_49c;
          in_ZmmResult._28_4_ = uVar25;
          in_ZmmResult._0_28_ = auVar329;
          uVar26 = uStack_498;
          in_ZmmResult._32_4_ = uVar26;
          uVar27 = uStack_494;
          in_ZmmResult._36_4_ = uVar27;
          in_ZmmResult._40_4_ = uStack_490;
          in_ZmmResult._44_4_ = _uStack_48c;
          in_ZmmResult._48_4_ = uStack_488;
          in_ZmmResult._52_4_ = uStack_484;
          in_ZmmResult._56_4_ = uStack_480;
          in_ZmmResult._60_4_ = uStack_47c;
          uVar187 = auVar28._8_8_;
          visibleSurf->set = (bool)SUB41(rrBeta.values.values[0],0);
          *(int3 *)&visibleSurf->field_0x1 = SUB43(rrBeta.values.values[0],1);
          visibleSurf->p = (Point3f)auVar28._4_12_;
          visibleSurf->n = (Normal3f)auVar329._16_12_;
          visibleSurf->ns = (Normal3f)in_ZmmResult._28_12_;
          visibleSurf->time = (Float)uStack_490;
          visibleSurf->dzdx = (Float)_uStack_48c;
          visibleSurf->dzdy = (Float)uStack_488;
          (visibleSurf->albedo).values.values[0] = (float)uStack_484;
          (visibleSurf->albedo).values.values[1] = (float)uStack_480;
          (visibleSurf->albedo).values.values[2] = (float)uStack_47c;
        }
        uVar292 = auVar190._8_8_;
        iVar38 = depth + 1;
        if (depth < this->maxDepth) {
          *(long *)(in_FS_OFFSET + -600) = *(long *)(in_FS_OFFSET + -600) + 1;
          depth = iVar38;
          if ((this->regularize == true) && (bVar37)) {
            *(long *)(in_FS_OFFSET + -0x288) = *(long *)(in_FS_OFFSET + -0x288) + 1;
            TaggedPointer<pbrt::IdealDiffuseBxDF,pbrt::DiffuseBxDF,pbrt::CoatedDiffuseBxDF,pbrt::CoatedConductorBxDF,pbrt::DielectricInterfaceBxDF,pbrt::ThinDielectricBxDF,pbrt::HairBxDF,pbrt::MeasuredBxDF,pbrt::ConductorBxDF,pbrt::NormalizedFresnelBxDF>
            ::Dispatch<pbrt::BxDFHandle::Regularize()::_lambda(auto:1)_1_>
                      ((TaggedPointer<pbrt::IdealDiffuseBxDF,pbrt::DiffuseBxDF,pbrt::CoatedDiffuseBxDF,pbrt::CoatedConductorBxDF,pbrt::DielectricInterfaceBxDF,pbrt::ThinDielectricBxDF,pbrt::HairBxDF,pbrt::MeasuredBxDF,pbrt::ConductorBxDF,pbrt::NormalizedFresnelBxDF>
                        *)&bsdf);
          }
          bVar36 = BSDF::IsNonSpecular(&bsdf);
          if (bVar36) {
            local_1e0.bits = *(uintptr_t *)local_760;
            SVar327 = SampleLd(this,(Interaction *)pSVar39,&bsdf,local_7b8,
                               (SamplerHandle *)&local_1e0,&T_hat,&uniPathPDF);
            local_788._8_8_ = uVar187;
            local_788._0_8_ = SVar327.values.values._0_8_;
            local_7c8._8_8_ = uVar292;
            local_7c8._0_8_ = SVar327.values.values._8_8_;
            SVar327 = SampledWavelengths::PDF(local_7b8);
            auVar308 = local_788._0_16_;
            auVar190 = local_7c8;
            a_01.values.values[2] = (float)local_7c8._0_4_;
            a_01.values.values[3] = (float)local_7c8._4_4_;
            a_01.values.values[0] = (float)local_788._0_4_;
            a_01.values.values[1] = (float)local_788._4_4_;
            auVar189 = ZEXT856((ulong)local_7c8._8_8_);
            auVar293 = ZEXT856((ulong)local_788._8_8_);
            local_7c8 = auVar190;
            local_788._0_16_ = auVar308;
            SVar327 = SafeDiv(a_01,SVar327);
            auVar273._0_8_ = SVar327.values.values._8_8_;
            auVar273._8_56_ = auVar189;
            auVar164._0_8_ = SVar327.values.values._0_8_;
            auVar164._8_56_ = auVar293;
            auVar190 = vmovlhps_avx(auVar164._0_16_,auVar273._0_16_);
            rrBeta.values.values._0_8_ = auVar190._0_8_;
            rrBeta.values.values[2] = auVar190._8_4_;
            rrBeta.values.values[3] = auVar190._12_4_;
            SampledSpectrum::operator+=(&L,&rrBeta);
          }
          IVar13 = (pSVar39->intr).super_Interaction.pi.super_Point3<pbrt::Interval>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
          uStack_4a8 = IVar13.low;
          uStack_4a4 = IVar13.high;
          rrBeta.values.values._0_8_ =
               (pSVar39->intr).super_Interaction.pi.super_Point3<pbrt::Interval>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval>.x;
          IVar188 = (pSVar39->intr).super_Interaction.pi.super_Point3<pbrt::Interval>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval>.y;
          rrBeta.values.values[2] = IVar188.low;
          rrBeta.values.values[3] = IVar188.high;
          uStack_498 = (pSVar39->intr).super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z;
          pNVar4 = &(pSVar39->intr).super_Interaction.n;
          uVar10 = (pNVar4->super_Tuple3<pbrt::Normal3,_float>).x;
          uVar15 = (pNVar4->super_Tuple3<pbrt::Normal3,_float>).y;
          prevIntrContext.n.super_Tuple3<pbrt::Normal3,_float>.y = (float)uVar15;
          prevIntrContext.n.super_Tuple3<pbrt::Normal3,_float>.x = (float)uVar10;
          _uStack_48c = (pSVar39->intr).shading.n.super_Tuple3<pbrt::Normal3,_float>.z;
          uVar11 = (pSVar39->intr).shading.n.super_Tuple3<pbrt::Normal3,_float>.x;
          uVar16 = (pSVar39->intr).shading.n.super_Tuple3<pbrt::Normal3,_float>.y;
          auVar29._12_4_ = uVar11;
          auVar29._0_12_ = (undefined1  [12])pNVar4->super_Tuple3<pbrt::Normal3,_float>;
          prevIntrContext.ns.super_Tuple3<pbrt::Normal3,_float>.z = (float)_uStack_48c;
          prevIntrContext.ns.super_Tuple3<pbrt::Normal3,_float>.y = (float)uVar16;
          prevIntrContext._32_8_ = auVar29._8_8_;
          prevIntrContext.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>
          .x = (Interval)rrBeta.values.values._0_8_;
          prevIntrContext.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>
          .y = IVar188;
          prevIntrContext.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>
          .z = IVar13;
          VVar323 = Tuple3<pbrt::Vector3,_float>::operator-
                              (&this_00->super_Tuple3<pbrt::Vector3,_float>);
          pTVar54 = local_760;
          local_788._8_8_ = IVar188;
          local_788._0_8_ = VVar323.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          local_7c8._0_4_ = VVar323.super_Tuple3<pbrt::Vector3,_float>.z;
          FVar72 = TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                   ::Dispatch<pbrt::SamplerHandle::Get1D()::_lambda(auto:1)_1_>(local_760);
          local_7a8._0_4_ = FVar72;
          PVar75 = TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                   ::Dispatch<pbrt::SamplerHandle::Get2D()::_lambda(auto:1)_1_>(pTVar54);
          auVar190 = local_788._0_16_;
          woRender.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_7c8._0_4_;
          woRender.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_788._0_4_;
          woRender.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_788._4_4_;
          auVar198 = ZEXT6064((undefined1  [60])0x0) << 0x20;
          local_788._0_16_ = auVar190;
          BSDF::Sample_f(&bs,&bsdf,woRender,(Float)local_7a8._0_4_,PVar75,Radiance,All);
          auVar190 = auVar198._0_16_;
          auVar293 = auVar198._8_56_;
          uStack_49c = uVar15;
          uStack_494 = uVar11;
          if (bs.set == false) {
            uVar51 = 3;
          }
          else {
            pBVar42 = pstd::optional<pbrt::BSDFSample>::value(&bs);
            pBVar43 = pstd::optional<pbrt::BSDFSample>::value(&bs);
            tVar74 = AbsDot<float>(&pBVar43->wi,&(pSVar39->intr).shading.n);
            auVar189 = extraout_var_03;
            SVar327 = SampledSpectrum::operator*(&pBVar42->f,tVar74);
            auVar274._0_8_ = SVar327.values.values._8_8_;
            auVar274._8_56_ = auVar293;
            auVar165._0_8_ = SVar327.values.values._0_8_;
            auVar165._8_56_ = auVar189;
            auVar190 = vmovlhps_avx(auVar165._0_16_,auVar274._0_16_);
            rrBeta.values.values._0_8_ = auVar190._0_8_;
            rrBeta.values.values[2] = auVar190._8_4_;
            rrBeta.values.values[3] = auVar190._12_4_;
            SampledSpectrum::operator*=(&T_hat,&rrBeta);
            lightPathPDF.values.values[0] = uniPathPDF.values.values[0];
            lightPathPDF.values.values[1] = uniPathPDF.values.values[1];
            lightPathPDF.values.values[2] = uniPathPDF.values.values[2];
            lightPathPDF.values.values[3] = uniPathPDF.values.values[3];
            pBVar42 = pstd::optional<pbrt::BSDFSample>::value(&bs);
            if (pBVar42->pdfIsProportional == true) {
              pBVar42 = pstd::optional<pbrt::BSDFSample>::value(&bs);
              auVar190 = local_788._0_16_;
              woRender_00.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_7c8._0_4_;
              woRender_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_788._0_4_;
              woRender_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_788._4_4_;
              local_788._0_16_ = auVar190;
              FVar72 = BSDF::PDF(&bsdf,woRender_00,
                                 (Vector3f)(pBVar42->wi).super_Tuple3<pbrt::Vector3,_float>,Radiance
                                 ,All);
              local_788._0_4_ = FVar72;
              pBVar42 = pstd::optional<pbrt::BSDFSample>::value(&bs);
              SampledSpectrum::operator*=(&T_hat,(float)local_788._0_4_ / pBVar42->pdf);
              FVar72 = (Float)local_788._0_4_;
            }
            else {
              pBVar42 = pstd::optional<pbrt::BSDFSample>::value(&bs);
              FVar72 = pBVar42->pdf;
            }
            SampledSpectrum::operator*=(&uniPathPDF,FVar72);
            Rescale(&T_hat,&uniPathPDF,&lightPathPDF);
            pBVar42 = pstd::optional<pbrt::BSDFSample>::value(&bs);
            specularBounce = (bool)((byte)(char)pBVar42->flags >> 4 & 1);
            pBVar42 = pstd::optional<pbrt::BSDFSample>::value(&bs);
            bVar37 = (bool)(bVar37 | (pBVar42->flags & Specular) == Unset);
            pBVar42 = pstd::optional<pbrt::BSDFSample>::value(&bs);
            if ((pBVar42->flags & Transmission) != Unset) {
              pBVar42 = pstd::optional<pbrt::BSDFSample>::value(&bs);
              local_6cc = local_6cc * pBVar42->eta * pBVar42->eta;
            }
            pBVar42 = pstd::optional<pbrt::BSDFSample>::value(&bs);
            uVar6 = (pBVar42->wi).super_Tuple3<pbrt::Vector3,_float>.x;
            uVar8 = (pBVar42->wi).super_Tuple3<pbrt::Vector3,_float>.y;
            local_788._4_4_ = uVar8;
            local_788._0_4_ = uVar6;
            local_788._8_8_ = 0;
            local_7c8._0_4_ = (pBVar42->wi).super_Tuple3<pbrt::Vector3,_float>.z;
            pBVar42 = pstd::optional<pbrt::BSDFSample>::value(&bs);
            flags = pBVar42->flags;
            pBVar42 = pstd::optional<pbrt::BSDFSample>::value(&bs);
            auVar190 = local_788._0_16_;
            wi.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_7c8._0_4_;
            wi.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_788._0_4_;
            wi.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_788._4_4_;
            local_788._0_16_ = auVar190;
            SurfaceInteraction::SpawnRay
                      ((RayDifferential *)&rrBeta,&pSVar39->intr,local_768,&bsdf,wi,flags,
                       pBVar42->eta);
            uVar187 = CONCAT44(uVar10,uStack_4a4);
            (local_768->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x = rrBeta.values.values[3];
            (local_768->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y = (float)uStack_4a8;
            *(undefined8 *)&(local_768->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z = uVar187;
            (local_768->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x = rrBeta.values.values[0];
            (local_768->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y = rrBeta.values.values[1];
            *(ulong *)&(local_768->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z =
                 CONCAT44(rrBeta.values.values[3],rrBeta.values.values[2]);
            uVar30 = CONCAT44(uVar11,uStack_498);
            (local_768->super_Ray).medium.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
            .bits = uVar30;
            auVar32._4_4_ = local_478;
            auVar32._0_4_ = uStack_47c;
            auVar32._8_4_ = uStack_474;
            auVar32._12_8_ = local_470;
            auVar31._20_8_ = local_468;
            auVar31._0_20_ = auVar32;
            auVar31._28_4_ = local_460;
            *(undefined1 (*) [32])&(ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y = auVar31;
            ray->hasDifferentials = (bool)(char)uVar16;
            *(int3 *)&ray->field_0x29 = (int3)((uint)uVar16 >> 8);
            (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.x = (float)_uStack_48c;
            (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.y = (float)uStack_488;
            (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.z = (float)uStack_484;
            (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.x = (float)uStack_480;
            (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y = (float)uStack_47c;
            *(ulong *)&(ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.z =
                 CONCAT44(uStack_474,local_478);
            local_1e8 = (undefined1  [8])
                        (this->super_RayIntegrator).super_ImageTileIntegrator.camera.
                        super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                        .bits;
            auVar198 = ZEXT1664(auVar32._0_16_);
            auVar153 = ZEXT1664(auVar297);
            auVar303 = ZEXT1664(auVar296);
            auVar315 = ZEXT1664(auVar63);
            SurfaceInteraction::GetBSSRDF
                      ((SurfaceInteraction *)&bssrdf,(RayDifferential *)pSVar39,
                       (SampledWavelengths *)local_768,(CameraHandle *)local_7b8,
                       (ScratchBuffer *)local_1e8);
            auVar63 = auVar315._0_16_;
            auVar296 = auVar303._0_16_;
            auVar297 = auVar153._0_16_;
            if (((undefined1  [16])_bssrdf & (undefined1  [16])0xffffffffffff) !=
                (undefined1  [16])0x0) {
              pBVar42 = pstd::optional<pbrt::BSDFSample>::value(&bs);
              pTVar54 = local_760;
              auVar63 = auVar315._0_16_;
              auVar296 = auVar303._0_16_;
              auVar297 = auVar153._0_16_;
              if ((pBVar42->flags & Transmission) != Unset) {
                FVar72 = TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                         ::Dispatch<pbrt::SamplerHandle::Get1D()::_lambda(auto:1)_1_>(local_760);
                local_788._0_4_ = FVar72;
                auVar170._0_8_ =
                     TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                     ::Dispatch<pbrt::SamplerHandle::Get2D()::_lambda(auto:1)_1_>(pTVar54);
                auVar170._8_56_ = extraout_var_04;
                auVar198 = ZEXT1664(auVar170._0_16_);
                BSSRDFHandle::SampleSp
                          ((optional<pbrt::BSSRDFProbeSegment> *)&sigma_maj,&bssrdf,
                           (Float)local_788._0_4_,auVar170._0_8_);
                auVar63 = auVar315._0_16_;
                auVar296 = auVar303._0_16_;
                auVar297 = auVar153._0_16_;
                uVar51 = 3;
                if (local_628 != false) {
                  pTVar54 = local_760;
                  FVar72 = TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                           ::Dispatch<pbrt::SamplerHandle::Get1D()::_lambda(auto:1)_1_>(local_760);
                  uVar40 = MixBits(CONCAT44((int)((ulong)pTVar54 >> 0x20),FVar72));
                  WeightedReservoirSampler<pbrt::SubsurfaceInteraction>::WeightedReservoirSampler
                            ((WeightedReservoirSampler<pbrt::SubsurfaceInteraction> *)&rho,uVar40);
                  pBVar44 = pstd::optional<pbrt::BSSRDFProbeSegment>::value
                                      ((optional<pbrt::BSSRDFProbeSegment> *)&sigma_maj);
                  auVar198 = _TmajAccum;
                  uVar7 = (pBVar44->p0).super_Tuple3<pbrt::Point3,_float>.x;
                  uVar9 = (pBVar44->p0).super_Tuple3<pbrt::Point3,_float>.y;
                  auVar80._4_4_ = uVar9;
                  auVar80._0_4_ = uVar7;
                  auVar80._8_8_ = 0;
                  fVar294 = (pBVar44->p0).super_Tuple3<pbrt::Point3,_float>.z;
                  auVar300._4_4_ = fVar294;
                  auVar300._0_4_ = fVar294;
                  auVar300._8_4_ = fVar294;
                  auVar300._12_4_ = fVar294;
                  TmajAccum.values.values = (array<float,_4>)vshufps_avx(auVar80,auVar80,0x50);
                  IVar188 = (Interval)vmovlps_avx(auVar300);
                  IStack_2f8.low = IVar188.low;
                  IStack_2f8.high = IVar188.high;
                  FStack_2f0 = (local_768->super_Ray).time;
                  uStack_2cc = auVar198._60_4_;
                  auStack_2ec = ZEXT1232(ZEXT812(0)) << 0x20;
                  while( true ) {
                    auVar297 = auVar153._0_16_;
                    auVar296 = auVar303._0_16_;
                    auVar63 = auVar315._0_16_;
                    pBVar44 = pstd::optional<pbrt::BSSRDFProbeSegment>::value
                                        ((optional<pbrt::BSSRDFProbeSegment> *)&sigma_maj);
                    Interaction::SpawnRayTo
                              ((Ray *)&bssrdfSample,(Interaction *)&TmajAccum,&pBVar44->p1);
                    auVar198 = ZEXT1664(ZEXT816(0) << 0x40);
                    if ((((bssrdfSample.Sp.values.values[3] == 0.0) && (bssrdfSample.pdf == 0.0)) &&
                        ((float)bssrdfSample._20_4_ == 0.0)) && (!NAN((float)bssrdfSample._20_4_)))
                    goto LAB_003ce192;
                    Integrator::Intersect
                              ((optional<pbrt::ShapeIntersection> *)&rrBeta,(Integrator *)this,
                               (Ray *)&bssrdfSample,1.0);
                    if (local_3b8 == false) break;
                    pSVar41 = pstd::optional<pbrt::ShapeIntersection>::value
                                        ((optional<pbrt::ShapeIntersection> *)&rrBeta);
                    in_ZmmResult._0_24_ =
                         *(undefined1 (*) [24])&(pSVar41->intr).super_Interaction.pi;
                    in_ZmmResult._24_4_ = (pSVar41->intr).super_Interaction.time;
                    in_ZmmResult._28_12_ =
                         *(undefined1 (*) [12])&(pSVar41->intr).super_Interaction.wo;
                    in_ZmmResult._40_12_ =
                         *(undefined1 (*) [12])&(pSVar41->intr).super_Interaction.n;
                    in_ZmmResult._52_8_ = (pSVar41->intr).super_Interaction.uv;
                    in_ZmmResult._60_4_ =
                         *(undefined4 *)&(pSVar41->intr).super_Interaction.field_0x3c;
                    auVar153 = ZEXT1664(auVar297);
                    auVar303 = ZEXT1664(auVar296);
                    auVar315 = ZEXT1664(auVar63);
                    _TmajAccum = in_ZmmResult;
                    pSVar41 = pstd::optional<pbrt::ShapeIntersection>::value
                                        ((optional<pbrt::ShapeIntersection> *)&rrBeta);
                    if ((pSVar41->intr).material.
                        super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
                        .bits == (pSVar39->intr).material.
                                 super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
                                 .bits) {
                      pSVar41 = pstd::optional<pbrt::ShapeIntersection>::value
                                          ((optional<pbrt::ShapeIntersection> *)&rrBeta);
                      Le.values.values._0_8_ =
                           (pSVar41->intr).super_Interaction.pi.super_Point3<pbrt::Interval>.
                           super_Tuple3<pbrt::Point3,_pbrt::Interval>.x;
                      IVar188 = (pSVar41->intr).super_Interaction.pi.super_Point3<pbrt::Interval>.
                                super_Tuple3<pbrt::Point3,_pbrt::Interval>.y;
                      Le.values.values[2] = IVar188.low;
                      Le.values.values[3] = IVar188.high;
                      WeightedReservoirSampler<pbrt::SubsurfaceInteraction>::Add
                                ((WeightedReservoirSampler<pbrt::SubsurfaceInteraction> *)&rho,
                                 (SubsurfaceInteraction *)&Le,1.0);
                    }
                    pstd::optional<pbrt::ShapeIntersection>::~optional
                              ((optional<pbrt::ShapeIntersection> *)&rrBeta);
                  }
                  pstd::optional<pbrt::ShapeIntersection>::~optional
                            ((optional<pbrt::ShapeIntersection> *)&rrBeta);
LAB_003ce192:
                  uVar51 = 3;
                  if (0.0 < local_610._0_4_) {
                    in_ZmmResult._8_4_ = IStack_600.low;
                    in_ZmmResult._12_4_ = IStack_600.high;
                    in_ZmmResult._0_4_ = local_608.low;
                    in_ZmmResult._4_4_ = local_608.high;
                    in_ZmmResult._16_4_ = IStack_5f8.low;
                    in_ZmmResult._20_4_ = IStack_5f8.high;
                    in_ZmmResult._24_8_ = pSStack_5f0;
                    in_ZmmResult._32_8_ = pSStack_5e8;
                    in_ZmmResult._40_8_ = pRStack_5e0;
                    in_ZmmResult._48_8_ = pTStack_5d8;
                    in_ZmmResult._56_8_ = pRStack_5d0;
                    Le.values.values[0] = local_608.low;
                    Le.values.values[1] = local_608.high;
                    Le.values.values[2] = IStack_600.low;
                    Le.values.values[3] = IStack_600.high;
                    auVar198 = ZEXT1664(CONCAT88(pRStack_5e0,pSStack_5e8));
                    func_04.si = (SubsurfaceInteraction *)&Le;
                    func_04.scratchBuffer = scratchBuffer;
                    TaggedPointer<pbrt::TabulatedBSSRDF>::
                    Dispatch<pbrt::BSSRDFHandle::ProbeIntersectionToSample(pbrt::SubsurfaceInteraction_const&,pbrt::ScratchBuffer&)const::_lambda(auto:1)_1_>
                              (&bssrdfSample,&bssrdf.super_TaggedPointer<pbrt::TabulatedBSSRDF>,
                               func_04);
                    bVar36 = SampledSpectrum::operator_cast_to_bool(&bssrdfSample.Sp);
                    auVar293 = auVar198._8_56_;
                    uVar51 = 3;
                    if ((bVar36) && ((bssrdfSample.pdf != 0.0 || (NAN(bssrdfSample.pdf))))) {
                      auVar189 = (undefined1  [56])0x0;
                      SVar327 = SampledSpectrum::operator*(&bssrdfSample.Sp,local_610._0_4_);
                      auVar280._0_8_ = SVar327.values.values._8_8_;
                      auVar280._8_56_ = auVar293;
                      auVar173._0_8_ = SVar327.values.values._0_8_;
                      auVar173._8_56_ = auVar189;
                      auVar190 = vmovlhps_avx(auVar173._0_16_,auVar280._0_16_);
                      sigma_a_3.values.values[0] = auVar190._0_4_;
                      sigma_a_3.values.values[1] = auVar190._4_4_;
                      sigma_a_3.values.values[2] = auVar190._8_4_;
                      sigma_a_3.values.values[3] = auVar190._12_4_;
                      auVar189 = (undefined1  [56])0x0;
                      SVar327 = SampledSpectrum::operator/(&sigma_a_3,bssrdfSample.pdf);
                      auVar281._0_8_ = SVar327.values.values._8_8_;
                      auVar281._8_56_ = auVar293;
                      auVar174._0_8_ = SVar327.values.values._0_8_;
                      auVar174._8_56_ = auVar189;
                      auVar190 = vmovlhps_avx(auVar174._0_16_,auVar281._0_16_);
                      rrBeta.values.values._0_8_ = auVar190._0_8_;
                      rrBeta.values.values[2] = auVar190._8_4_;
                      rrBeta.values.values[3] = auVar190._12_4_;
                      SampledSpectrum::operator*=(&T_hat,&rrBeta);
                      SubsurfaceInteraction::operator_cast_to_SurfaceInteraction
                                ((SubsurfaceInteraction *)&Le);
                      fVar294 = bssrdfSample.wo.super_Tuple3<pbrt::Vector3,_float>.z;
                      uVar187 = bssrdfSample.wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                      bVar37 = true;
                      uStack_494 = bssrdfSample.wo.super_Tuple3<pbrt::Vector3,_float>.z;
                      uStack_49c = bssrdfSample.wo.super_Tuple3<pbrt::Vector3,_float>.x;
                      uStack_498 = bssrdfSample.wo.super_Tuple3<pbrt::Vector3,_float>.y;
                      if (this->regularize == true) {
                        *(long *)(in_FS_OFFSET + -0x288) = *(long *)(in_FS_OFFSET + -0x288) + 1;
                        TaggedPointer<pbrt::IdealDiffuseBxDF,pbrt::DiffuseBxDF,pbrt::CoatedDiffuseBxDF,pbrt::CoatedConductorBxDF,pbrt::DielectricInterfaceBxDF,pbrt::ThinDielectricBxDF,pbrt::HairBxDF,pbrt::MeasuredBxDF,pbrt::ConductorBxDF,pbrt::NormalizedFresnelBxDF>
                        ::Dispatch<pbrt::BxDFHandle::Regularize()::_lambda(auto:1)_1_>
                                  ((TaggedPointer<pbrt::IdealDiffuseBxDF,pbrt::DiffuseBxDF,pbrt::CoatedDiffuseBxDF,pbrt::CoatedConductorBxDF,pbrt::DielectricInterfaceBxDF,pbrt::ThinDielectricBxDF,pbrt::HairBxDF,pbrt::MeasuredBxDF,pbrt::ConductorBxDF,pbrt::NormalizedFresnelBxDF>
                                    *)&bssrdfSample.Sw);
                      }
                      else {
                        *(long *)(in_FS_OFFSET + -0x280) = *(long *)(in_FS_OFFSET + -0x280) + 1;
                      }
                      fVar301 = aNStack_438[0].super_Tuple3<pbrt::Normal3,_float>.z;
                      sigma_a_3.values.values[0] = rrBeta.values.values[0];
                      sigma_a_3.values.values[1] = rrBeta.values.values[1];
                      sigma_a_3.values.values[2] = rrBeta.values.values[2];
                      sigma_a_3.values.values[3] = rrBeta.values.values[3];
                      fStack_354 = local_440._8_4_;
                      local_350 = local_440._12_4_;
                      prevIntrContext.pi.super_Point3<pbrt::Interval>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low = rrBeta.values.values[0];
                      prevIntrContext.pi.super_Point3<pbrt::Interval>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high = rrBeta.values.values[1];
                      IVar188.high = rrBeta.values.values[3];
                      IVar188.low = rrBeta.values.values[2];
                      uVar50 = CONCAT44(fStack_354,uStack_488);
                      prevIntrContext.n.super_Tuple3<pbrt::Normal3,_float>.y = (float)_uStack_48c;
                      prevIntrContext.n.super_Tuple3<pbrt::Normal3,_float>.x = (float)uVar16;
                      prevIntrContext.ns.super_Tuple3<pbrt::Normal3,_float>.z =
                           aNStack_438[0].super_Tuple3<pbrt::Normal3,_float>.z;
                      prevIntrContext.ns.super_Tuple3<pbrt::Normal3,_float>.y = local_350;
                      prevIntrContext.n.super_Tuple3<pbrt::Normal3,_float>.z = (float)uStack_488;
                      prevIntrContext.ns.super_Tuple3<pbrt::Normal3,_float>.x = fStack_354;
                      local_1f0.bits = *(uintptr_t *)local_760;
                      prevIntrContext.pi.super_Point3<pbrt::Interval>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.y = IVar188;
                      prevIntrContext.pi.super_Point3<pbrt::Interval>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.z = IVar13;
                      SVar327 = SampleLd(this,(Interaction *)&rrBeta,&bssrdfSample.Sw,local_7b8,
                                         (SamplerHandle *)&local_1f0,&T_hat,&uniPathPDF);
                      local_7c8._0_8_ = SVar327.values.values._8_8_;
                      local_788._8_8_ = IVar188;
                      local_788._0_8_ = SVar327.values.values._0_8_;
                      local_7c8._8_8_ = uVar50;
                      SVar327 = SampledWavelengths::PDF(local_7b8);
                      auVar190 = local_788._0_16_;
                      a_02.values.values[2] = (float)local_7c8._0_4_;
                      a_02.values.values[3] = (float)local_7c8._4_4_;
                      a_02.values.values[0] = (float)local_788._0_4_;
                      a_02.values.values[1] = (float)local_788._4_4_;
                      auVar189 = ZEXT856((ulong)local_7c8._8_8_);
                      auVar293 = ZEXT856((ulong)local_788._8_8_);
                      local_788._0_16_ = auVar190;
                      SVar327 = SafeDiv(a_02,SVar327);
                      auVar282._0_8_ = SVar327.values.values._8_8_;
                      auVar282._8_56_ = auVar189;
                      auVar175._0_8_ = SVar327.values.values._0_8_;
                      auVar175._8_56_ = auVar293;
                      auVar190 = vmovlhps_avx(auVar175._0_16_,auVar282._0_16_);
                      sigma_a_3.values.values[0] = auVar190._0_4_;
                      sigma_a_3.values.values[1] = auVar190._4_4_;
                      sigma_a_3.values.values[2] = auVar190._8_4_;
                      sigma_a_3.values.values[3] = auVar190._12_4_;
                      SampledSpectrum::operator+=(&L,&sigma_a_3);
                      pTVar54 = local_760;
                      FVar72 = TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                               ::Dispatch<pbrt::SamplerHandle::Get1D()::_lambda(auto:1)_1_>
                                         (local_760);
                      uVar292 = bssrdfSample.wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                      local_788._0_4_ = FVar72;
                      local_7c8._8_8_ = 0;
                      bssrdfSample.wo.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar187;
                      bssrdfSample.wo.super_Tuple3<pbrt::Vector3,_float>.y = SUB84(uVar187,4);
                      local_7c8._0_4_ = bssrdfSample.wo.super_Tuple3<pbrt::Vector3,_float>.x;
                      local_7c8._4_4_ = bssrdfSample.wo.super_Tuple3<pbrt::Vector3,_float>.y;
                      local_7a8._0_4_ = fVar294;
                      bssrdfSample.wo.super_Tuple3<pbrt::Vector3,_float>._0_8_ = uVar292;
                      PVar75 = TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                               ::Dispatch<pbrt::SamplerHandle::Get2D()::_lambda(auto:1)_1_>(pTVar54)
                      ;
                      auVar190 = local_7c8;
                      uVar51 = 3;
                      woRender_01.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_7a8._0_4_;
                      woRender_01.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_7c8._0_4_;
                      woRender_01.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_7c8._4_4_;
                      auVar198 = ZEXT6064((undefined1  [60])0x0) << 0x20;
                      local_7c8 = auVar190;
                      BSDF::Sample_f((optional<pbrt::BSDFSample> *)&sigma_t,&bssrdfSample.Sw,
                                     woRender_01,(Float)local_788._0_4_,PVar75,Radiance,All);
                      auVar293 = auVar198._8_56_;
                      auVar190 = auVar198._0_16_;
                      if (local_18c != false) {
                        pBVar42 = pstd::optional<pbrt::BSDFSample>::value
                                            ((optional<pbrt::BSDFSample> *)&sigma_t);
                        pBVar43 = pstd::optional<pbrt::BSDFSample>::value
                                            ((optional<pbrt::BSDFSample> *)&sigma_t);
                        tVar74 = AbsDot<float>(&pBVar43->wi,aNStack_438);
                        auVar189 = extraout_var_05;
                        SVar327 = SampledSpectrum::operator*(&pBVar42->f,tVar74);
                        auVar283._0_8_ = SVar327.values.values._8_8_;
                        auVar283._8_56_ = auVar293;
                        auVar176._0_8_ = SVar327.values.values._0_8_;
                        auVar176._8_56_ = auVar189;
                        auVar190 = vmovlhps_avx(auVar176._0_16_,auVar283._0_16_);
                        sigma_a_3.values.values[0] = auVar190._0_4_;
                        sigma_a_3.values.values[1] = auVar190._4_4_;
                        sigma_a_3.values.values[2] = auVar190._8_4_;
                        sigma_a_3.values.values[3] = auVar190._12_4_;
                        SampledSpectrum::operator*=(&T_hat,&sigma_a_3);
                        lightPathPDF.values.values[0] = uniPathPDF.values.values[0];
                        lightPathPDF.values.values[1] = uniPathPDF.values.values[1];
                        lightPathPDF.values.values[2] = uniPathPDF.values.values[2];
                        lightPathPDF.values.values[3] = uniPathPDF.values.values[3];
                        pBVar42 = pstd::optional<pbrt::BSDFSample>::value
                                            ((optional<pbrt::BSDFSample> *)&sigma_t);
                        SampledSpectrum::operator*=(&uniPathPDF,pBVar42->pdf);
                        pBVar42 = pstd::optional<pbrt::BSDFSample>::value
                                            ((optional<pbrt::BSDFSample> *)&sigma_t);
                        specularBounce = (bool)((byte)(char)pBVar42->flags >> 4 & 1);
                        pBVar42 = pstd::optional<pbrt::BSDFSample>::value
                                            ((optional<pbrt::BSDFSample> *)&sigma_t);
                        Interaction::SpawnRay
                                  ((RayDifferential *)&sigma_a_3,(Interaction *)&rrBeta,&pBVar42->wi
                                  );
                        uVar187 = CONCAT44(uVar16,uStack_4a4);
                        (local_768->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x =
                             sigma_a_3.values.values[3];
                        (local_768->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y =
                             (float)uStack_4a8;
                        *(undefined8 *)
                         &(local_768->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z = uVar187;
                        (local_768->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x =
                             sigma_a_3.values.values[0];
                        (local_768->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y =
                             sigma_a_3.values.values[1];
                        *(ulong *)&(local_768->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z =
                             CONCAT44(sigma_a_3.values.values[3],sigma_a_3.values.values[2]);
                        (local_768->super_Ray).medium.
                        super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                        .bits = CONCAT44(fStack_354,uStack_488);
                        auVar33._4_8_ = uStack_338;
                        auVar33._0_4_ = fStack_33c;
                        auVar33._12_20_ = auStack_330;
                        auVar190 = auVar33._0_16_;
                        uVar51 = 0;
                        *(undefined1 (*) [32])&(ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y =
                             auVar33;
                        ray->hasDifferentials = (bool)SUB41(local_350,0);
                        *(int3 *)&ray->field_0x29 = (int3)((uint)local_350 >> 8);
                        (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.x = fVar301;
                        (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.y = fStack_348;
                        (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.z = fStack_344;
                        (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.x = fStack_340;
                        (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y = fStack_33c;
                        *(undefined8 *)&(ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.z =
                             uStack_338;
                      }
                      auVar198 = ZEXT1664(auVar190);
                      pstd::optional<pbrt::BSDFSample>::~optional
                                ((optional<pbrt::BSDFSample> *)&sigma_t);
                    }
                  }
                }
                pstd::optional<pbrt::BSSRDFProbeSegment>::~optional
                          ((optional<pbrt::BSSRDFProbeSegment> *)&sigma_maj);
                auVar190 = auVar198._0_16_;
                if (uVar51 != 0) goto LAB_003ce6e2;
              }
            }
            bVar36 = SampledSpectrum::operator_cast_to_bool(&T_hat);
            auVar190 = auVar198._0_16_;
            auVar293 = auVar198._8_56_;
            uVar51 = 3;
            if (bVar36) {
              auVar189 = (undefined1  [56])0x0;
              SVar327 = SampledSpectrum::operator*(&T_hat,local_6cc);
              auVar284._0_8_ = SVar327.values.values._8_8_;
              auVar284._8_56_ = auVar293;
              auVar177._0_8_ = SVar327.values.values._0_8_;
              auVar177._8_56_ = auVar189;
              rho.values.values = (array<float,_4>)vmovlhps_avx(auVar177._0_16_,auVar284._0_16_);
              FVar72 = SampledSpectrum::Average(&uniPathPDF);
              auVar189 = extraout_var_06;
              SVar327 = SampledSpectrum::operator/(&rho,FVar72);
              auVar285._0_8_ = SVar327.values.values._8_8_;
              auVar285._8_56_ = auVar293;
              auVar178._0_8_ = SVar327.values.values._0_8_;
              auVar178._8_56_ = auVar189;
              auVar190 = vmovlhps_avx(auVar178._0_16_,auVar285._0_16_);
              rrBeta.values.values._0_8_ = auVar190._0_8_;
              rrBeta.values.values[2] = auVar190._8_4_;
              rrBeta.values.values[3] = auVar190._12_4_;
              FVar72 = SampledSpectrum::MaxComponentValue(&rrBeta);
              auVar190 = SUB6416(ZEXT464(0x3f800000),0);
              uVar51 = 0;
              if ((FVar72 < 1.0) && (1 < depth)) {
                FVar72 = SampledSpectrum::MaxComponentValue(&rrBeta);
                local_788._0_4_ = FVar72;
                FVar72 = TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                         ::Dispatch<pbrt::SamplerHandle::Get1D()::_lambda(auto:1)_1_>(local_760);
                auVar190 = vmaxss_avx(ZEXT416((uint)(1.0 - (float)local_788._0_4_)),ZEXT416(0));
                uVar51 = 3;
                if (auVar190._0_4_ <= FVar72) {
                  fVar294 = 1.0 - auVar190._0_4_;
                  local_788._0_4_ = fVar294;
                  SampledSpectrum::operator*=(&uniPathPDF,fVar294);
                  SampledSpectrum::operator*=(&lightPathPDF,(Float)local_788._0_4_);
                  uVar51 = 0;
                }
              }
            }
          }
LAB_003ce6e2:
          pstd::optional<pbrt::BSDFSample>::~optional(&bs);
          uStack_4a0 = uVar10;
          uStack_490 = uVar16;
        }
        else {
          uVar51 = 1;
          depth = iVar38;
        }
      }
    }
    else {
      scattered = false;
      terminated = false;
      local_7c8._0_4_ = 0x7f800000;
      if (si.set == true) {
        pSVar39 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
        local_7c8._0_4_ = pSVar39->tHit;
      }
      FVar72 = TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
               ::Dispatch<pbrt::SamplerHandle::Get1D()::_lambda(auto:1)_1_>(local_760);
      uVar40 = Hash<float>(FVar72);
      FVar72 = TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
               ::Dispatch<pbrt::SamplerHandle::Get1D()::_lambda(auto:1)_1_>(local_760);
      seed = Hash<float>(FVar72);
      RNG::SetSequence(&rng,uVar40,seed);
      uVar187._0_4_ = (local_768->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x;
      uVar187._4_4_ = (local_768->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y;
      auVar190._0_12_ = *(undefined1 (*) [12])&(local_768->super_Ray).d;
      auVar190._12_4_ = (local_768->super_Ray).time;
      auVar293 = ZEXT856(auVar190._8_8_);
      fStack_210 = (float)*(undefined8 *)
                           &(local_768->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z;
      fStack_20c = auVar190._0_4_;
      FVar72 = TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
               ::Dispatch<pbrt::SamplerHandle::Get1D()::_lambda(auto:1)_1_>(local_760);
      pTStack_5d8 = local_760;
      pRStack_5d0 = local_768;
      pSStack_5e8 = local_7b8;
      auVar71 = in_ZmmResult._16_48_;
      local_788._0_4_ = FVar72;
      TVar12.bits = (local_768->super_Ray).medium.
                    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                    .bits;
      this_02 = (DenselySampledSpectrum *)(TVar12.bits & 0xffffffffffff);
      if (TVar12.bits < (float **)0x3000000000000) {
        if ((TVar12.bits & 0x3000000000000) == 0x2000000000000) {
          rho.values.values._8_8_ = &terminated;
          rho.values.values._0_8_ = &T_hat;
          sigma_a_3.values.values[2] = fStack_210;
          sigma_a_3.values.values[3] = fStack_20c;
          local_7ac = (float)local_7c8._0_4_;
          sigma_a_3.values.values[0] = (float)uVar187;
          sigma_a_3.values.values[1] = uVar187._4_4_;
          SampledSpectrum::SampledSpectrum(&TmajAccum,1.0);
          Transform::ApplyInverse
                    ((Ray *)&Le,(Transform *)(this_02 + 3),(Ray *)&sigma_a_3,&local_7ac);
          tVar73 = Length<float>((Vector3<float> *)(Le.values.values + 3));
          local_7ac = tVar73 * local_7ac;
          auVar189 = (undefined1  [56])0x0;
          VVar323 = Normalize<float>((Vector3<float> *)(Le.values.values + 3));
          auVar84._0_8_ = VVar323.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar84._8_56_ = auVar189;
          uVar187 = vmovlps_avx(auVar84._0_16_);
          Le.values.values[3] = (float)uVar187;
          fStack_588 = (float)((ulong)uVar187 >> 0x20);
          pvVar1 = &this_02->values;
          bVar36 = Bounds3<float>::IntersectP
                             ((Bounds3<float> *)pvVar1,(Point3f *)&Le,
                              (Vector3f *)(Le.values.values + 3),local_7ac,&tMin,&tMax);
          auVar322 = auVar321._4_12_;
          auVar71 = in_ZmmResult._16_48_;
          auVar316 = auVar315._4_12_;
          auVar304 = auVar303._4_12_;
          if (bVar36) {
            auVar189 = (undefined1  [56])0x0;
            local_7c8._0_4_ = *(Float *)&this_02[2].values.nStored;
            SVar327 = DenselySampledSpectrum::Sample
                                ((DenselySampledSpectrum *)&(this_02->values).nStored,local_7b8);
            auVar199._0_8_ = SVar327.values.values._8_8_;
            auVar199._8_56_ = auVar293;
            auVar85._0_8_ = SVar327.values.values._0_8_;
            auVar85._8_56_ = auVar189;
            auVar297 = vmovlhps_avx(auVar85._0_16_,auVar199._0_16_);
            rrBeta.values.values._0_8_ = auVar297._0_8_;
            rrBeta.values.values[2] = auVar297._8_4_;
            rrBeta.values.values[3] = auVar297._12_4_;
            auVar189 = (undefined1  [56])0x0;
            SVar327 = SampledSpectrum::operator*(&rrBeta,(Float)local_7c8._0_4_);
            auVar200._0_8_ = SVar327.values.values._8_8_;
            auVar200._8_56_ = auVar293;
            auVar86._0_8_ = SVar327.values.values._0_8_;
            auVar86._8_56_ = auVar189;
            bsdf._0_16_ = vmovlhps_avx(auVar86._0_16_,auVar200._0_16_);
            local_7c8._0_4_ = *(undefined4 *)&this_02[2].values.nStored;
            auVar189 = (undefined1  [56])0x0;
            SVar327 = DenselySampledSpectrum::Sample
                                ((DenselySampledSpectrum *)&this_02[1].values.nStored,local_7b8);
            auVar201._0_8_ = SVar327.values.values._8_8_;
            auVar201._8_56_ = auVar293;
            auVar87._0_8_ = SVar327.values.values._0_8_;
            auVar87._8_56_ = auVar189;
            auVar297 = vmovlhps_avx(auVar87._0_16_,auVar201._0_16_);
            rrBeta.values.values._0_8_ = auVar297._0_8_;
            rrBeta.values.values[2] = auVar297._8_4_;
            rrBeta.values.values[3] = auVar297._12_4_;
            auVar189 = (undefined1  [56])0x0;
            SVar327 = SampledSpectrum::operator*(&rrBeta,(Float)local_7c8._0_4_);
            auVar202._0_8_ = SVar327.values.values._8_8_;
            auVar202._8_56_ = auVar293;
            auVar88._0_8_ = SVar327.values.values._0_8_;
            auVar88._8_56_ = auVar189;
            bs.optionalValue._0_16_ = vmovlhps_avx(auVar88._0_16_,auVar202._0_16_);
            auVar189 = ZEXT856(bs.optionalValue._8_8_);
            SVar327 = SampledSpectrum::operator+((SampledSpectrum *)&bsdf,(SampledSpectrum *)&bs);
            auVar203._0_8_ = SVar327.values.values._8_8_;
            auVar203._8_56_ = auVar293;
            auVar89._0_8_ = SVar327.values.values._0_8_;
            auVar89._8_56_ = auVar189;
            sigma_t.values.values = (array<float,_4>)vmovlhps_avx(auVar89._0_16_,auVar203._0_16_);
            auVar293 = ZEXT856(sigma_t.values.values._8_8_);
            VVar324 = Bounds3<float>::Diagonal((Bounds3<float> *)pvVar1);
            auVar291 = auVar203._4_60_;
            local_7c8._0_4_ = VVar324.super_Tuple3<pbrt::Vector3,_float>.z;
            auVar90._0_8_ = VVar324.super_Tuple3<pbrt::Vector3,_float>._0_8_;
            auVar90._8_56_ = auVar293;
            local_7a8 = auVar90._0_16_;
            VVar324 = Bounds3<float>::Offset((Bounds3<float> *)pvVar1,(Point3<float> *)&Le);
            bssrdfSample.Sp.values.values[2] = VVar324.super_Tuple3<pbrt::Vector3,_float>.z;
            auVar91._0_8_ = VVar324.super_Tuple3<pbrt::Vector3,_float>._0_8_;
            auVar91._8_56_ = auVar293;
            auVar295._4_4_ = fStack_588;
            auVar295._0_4_ = Le.values.values[3];
            auVar295._8_8_ = 0;
            bssrdfSample.Sp.values.values._0_8_ = vmovlps_avx(auVar91._0_16_);
            auVar293 = (undefined1  [56])0x0;
            auVar297 = vdivps_avx(auVar295,local_7a8);
            bssrdfSample._20_4_ =
                 VVar323.super_Tuple3<pbrt::Vector3,_float>.z / (float)local_7c8._0_4_;
            uVar187 = vmovlps_avx(auVar297);
            bssrdfSample.Sp.values.values[3] = (float)uVar187;
            bssrdfSample.pdf = (Float)((ulong)uVar187 >> 0x20);
            bssrdfSample.Sw.bxdf.
            super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
            .bits._0_4_ = 0;
            bssrdfSample.Sw.ng.super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
            bssrdfSample.Sw.ng.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
            PVar325 = Ray::operator()((Ray *)&bssrdfSample,tMin);
            auVar204._0_4_ = PVar325.super_Tuple3<pbrt::Point3,_float>.z;
            auVar204._4_60_ = auVar291;
            auVar92._0_8_ = PVar325.super_Tuple3<pbrt::Point3,_float>._0_8_;
            auVar92._8_56_ = auVar293;
            piVar2 = &this_02[7].lambda_max;
            uVar51 = this_02[7].lambda_min;
            uVar50 = CONCAT44(0,uVar51);
            auVar296 = vmovshdup_avx(auVar92._0_16_);
            auVar308 = ZEXT816(0) << 0x40;
            pDVar3 = this_02 + 7;
            lVar57 = 0;
            iVar38 = this_02[7].lambda_max;
            local_7a8._0_8_ = uVar50;
            fVar301 = (float)iVar38;
            auVar306._0_4_ = (float)(iVar38 + -1);
            auVar306._4_12_ = auVar304;
            auVar63 = ZEXT416((uint)(auVar296._0_4_ * fVar301));
            auVar297 = vminss_avx(auVar306,auVar63);
            uVar187 = vcmpss_avx512f(auVar63,auVar308,1);
            fVar302 = (float)(int)uVar51;
            auVar303 = ZEXT1664(CONCAT124(auVar316,fVar302));
            auVar312._0_4_ = (float)(int)(uVar51 - 1);
            auVar312._4_12_ = auVar316;
            iVar53 = *(int *)&this_02[7].values.alloc.memoryResource;
            iVar45 = (int)(float)((uint)!(bool)((byte)uVar187 & 1) * auVar297._0_4_);
            auVar63 = ZEXT416((uint)(PVar325.super_Tuple3<pbrt::Point3,_float>.x * fVar302));
            auVar297 = vminss_avx(auVar312,auVar63);
            uVar187 = vcmpss_avx512f(auVar63,auVar308,1);
            fVar305 = (float)iVar53;
            auVar318._0_4_ = (float)(iVar53 + -1);
            auVar318._4_12_ = auVar322;
            auVar65._16_48_ = auVar71;
            auVar65._0_16_ = auVar297;
            fVar294 = (float)((uint)!(bool)((byte)uVar187 & 1) * auVar297._0_4_);
            auVar64._4_60_ = auVar65._4_60_;
            auVar64._0_4_ = fVar294;
            auVar63 = auVar64._0_16_;
            iVar53 = (int)fVar294;
            auVar297 = vminss_avx(auVar318,ZEXT416((uint)(auVar204._0_4_ * fVar305)));
            uVar187 = vcmpss_avx512f(ZEXT416((uint)(auVar204._0_4_ * fVar305)),auVar308,1);
            auVar66._16_48_ = auVar71;
            auVar66._0_16_ = auVar297;
            fVar294 = (float)((uint)!(bool)((byte)uVar187 & 1) * auVar297._0_4_);
            in_ZmmResult._4_60_ = auVar66._4_60_;
            in_ZmmResult._0_4_ = fVar294;
            iVar55 = (int)fVar294;
            auVar321 = ZEXT464((uint)tMin);
            local_7c8._0_4_ = tMin;
            while( true ) {
              auVar315 = ZEXT1664(auVar63);
              if (lVar57 == 3) break;
              iVar56 = (int)lVar57;
              if (iVar56 == 1) {
                voxel[1] = iVar45;
                piVar58 = voxelLimit + 1;
                piVar59 = step + 1;
                pFVar52 = deltaT + 1;
                pfVar60 = nextCrossingT + 1;
                pfVar48 = &bssrdfSample.pdf;
                iVar49 = iVar45;
              }
              else {
                pfVar48 = bssrdfSample.Sp.values.values + 3;
                if (iVar56 == 0) {
                  voxel[lVar57] = iVar53;
                  piVar58 = voxelLimit;
                  piVar59 = step;
                  pFVar52 = deltaT;
                  pfVar60 = nextCrossingT;
                  iVar49 = iVar53;
                }
                else {
                  piVar58 = voxelLimit + 2;
                  piVar59 = step + 2;
                  pFVar52 = deltaT + 2;
                  pfVar60 = nextCrossingT + 2;
                  pfVar48 = (float *)&bssrdfSample.field_0x14;
                  voxel[lVar57] = iVar55;
                  iVar49 = iVar55;
                }
              }
              pFVar46 = bssrdfSample.Sp.values.values + 3;
              if ((*pfVar48 == 0.0) && (!NAN(*pfVar48))) {
                pFVar62 = pFVar46;
                if ((iVar56 != 0) && (pFVar62 = &bssrdfSample.pdf, iVar56 != 1)) {
                  pFVar62 = (Float *)&bssrdfSample.field_0x14;
                }
                *pFVar62 = 0.0;
              }
              pFVar62 = pFVar46;
              if ((iVar56 != 0) && (pFVar62 = &bssrdfSample.pdf, iVar56 != 1)) {
                pFVar62 = (Float *)&bssrdfSample.field_0x14;
              }
              if (0.0 <= *pFVar62) {
                pDVar47 = pDVar3;
                fVar294 = fVar302;
                fVar317 = PVar325.super_Tuple3<pbrt::Point3,_float>.x;
                if ((iVar56 != 0) &&
                   (pFVar46 = &bssrdfSample.pdf, pDVar47 = (DenselySampledSpectrum *)piVar2,
                   fVar294 = fVar301, fVar317 = auVar296._0_4_, iVar56 != 1)) {
                  pFVar46 = (Float *)&bssrdfSample.field_0x14;
                  pDVar47 = (DenselySampledSpectrum *)&this_02[7].values;
                  fVar294 = fVar305;
                  fVar317 = auVar204._0_4_;
                }
                *piVar59 = 1;
                fVar5 = *pFVar46;
                fVar317 = ((float)(iVar49 + 1) / fVar294 - fVar317) / fVar5 + tMin;
                auVar321 = ZEXT464((uint)fVar317);
                *pfVar60 = fVar317;
                *pFVar52 = 1.0 / (fVar5 * fVar294);
                iVar56 = pDVar47->lambda_min;
              }
              else {
                auVar321 = ZEXT1664(auVar92._0_16_);
                pDVar47 = pDVar3;
                fVar294 = fVar302;
                if (iVar56 != 0) {
                  pFVar46 = &bssrdfSample.pdf;
                  auVar321 = ZEXT1664(auVar296);
                  pDVar47 = (DenselySampledSpectrum *)piVar2;
                  fVar294 = fVar301;
                  if (iVar56 != 1) {
                    pFVar46 = (Float *)&bssrdfSample.field_0x14;
                    auVar321 = ZEXT1664(auVar204._0_16_);
                    pDVar47 = (DenselySampledSpectrum *)&this_02[7].values;
                    fVar294 = fVar305;
                  }
                }
                fVar317 = *pFVar46;
                *pfVar60 = ((float)iVar49 / fVar294 - auVar321._0_4_) / fVar317 + tMin;
                iVar56 = pDVar47->lambda_min;
                *piVar59 = -1;
                *pFVar52 = -1.0 / (fVar317 * (float)iVar56);
                iVar56 = -1;
              }
              auVar63 = ZEXT416(0);
              *piVar58 = iVar56;
              lVar57 = lVar57 + 1;
            }
            TVar61.bits = (ulong)((long)&this_02[2].values.nStored + 4U) | 0x1000000000000;
            while( true ) {
              iVar53 = *(int *)(&DAT_02853da0 +
                               (ulong)((uint)(nextCrossingT[1] < nextCrossingT[2]) |
                                      (uint)(nextCrossingT[0] < nextCrossingT[1]) * 4 +
                                      (uint)(nextCrossingT[0] < nextCrossingT[2]) * 2) * 4);
              fVar294 = nextCrossingT[iVar53];
              auVar189 = (undefined1  [56])0x0;
              auVar297 = vminss_avx(ZEXT416((uint)fVar294),ZEXT416((uint)tMax));
              local_708 = auVar297._0_4_;
              auVar293 = (undefined1  [56])0x0;
              SVar327 = SampledSpectrum::operator*
                                  (&sigma_t,this_02[6].values.ptr
                                            [(long)((iVar38 * voxel[2] + voxel[1]) * (int)uVar50) +
                                             (long)voxel[0]]);
              auVar223._0_8_ = SVar327.values.values._8_8_;
              auVar223._8_56_ = auVar189;
              auVar117._0_8_ = SVar327.values.values._0_8_;
              auVar117._8_56_ = auVar293;
              auVar198 = ZEXT1664(auVar117._0_16_);
              sigma_maj.values.values =
                   (array<float,_4>)vmovlhps_avx(auVar117._0_16_,auVar223._0_16_);
              auVar293 = ZEXT856(sigma_maj.values.values._8_8_);
              if ((SVar327.values.values[0] != 0.0) || (NAN(SVar327.values.values[0]))) {
                while( true ) {
                  FVar72 = SampleExponential((Float)local_788._0_4_,auVar198._0_4_);
                  local_7a8._0_4_ = FVar72;
                  fVar301 = RNG::Uniform<float>(&rng);
                  auVar296 = auVar321._0_16_;
                  auVar297 = auVar315._0_16_;
                  local_788._0_4_ = fVar301;
                  auVar293 = (undefined1  [56])0x0;
                  fVar301 = (float)local_7a8._0_4_ + (float)local_7c8._0_4_;
                  auVar189 = (undefined1  [56])0x0;
                  if (local_708 <= fVar301) break;
                  auVar293 = (undefined1  [56])0x0;
                  if (fVar301 < tMax) {
                    local_7a8._0_4_ = fVar301;
                    SVar327 = SampledSpectrum::operator-(&sigma_maj);
                    auVar227._0_8_ = SVar327.values.values._8_8_;
                    auVar227._8_56_ = auVar189;
                    auVar121._0_8_ = SVar327.values.values._0_8_;
                    auVar121._8_56_ = auVar293;
                    d.values.values = (array<float,_4>)vmovlhps_avx(auVar121._0_16_,auVar227._0_16_)
                    ;
                    auVar293 = (undefined1  [56])0x0;
                    SVar327 = SampledSpectrum::operator*
                                        (&d,(float)local_7a8._0_4_ - (float)local_7c8._0_4_);
                    auVar228._0_8_ = SVar327.values.values._8_8_;
                    auVar228._8_56_ = auVar189;
                    auVar122._0_8_ = SVar327.values.values._0_8_;
                    auVar122._8_56_ = auVar293;
                    auVar63 = vmovlhps_avx(auVar122._0_16_,auVar228._0_16_);
                    auVar293 = ZEXT856(auVar63._8_8_);
                    rrBeta.values.values._0_8_ = auVar63._0_8_;
                    rrBeta.values.values[2] = auVar63._8_4_;
                    rrBeta.values.values[3] = auVar63._12_4_;
                    SVar327 = FastExp(&rrBeta);
                    auVar229._0_8_ = SVar327.values.values._8_8_;
                    auVar229._8_56_ = auVar189;
                    auVar123._0_8_ = SVar327.values.values._0_8_;
                    auVar123._8_56_ = auVar293;
                    _bssrdf = (array<float,_4>)vmovlhps_avx(auVar123._0_16_,auVar229._0_16_);
                    auVar293 = (undefined1  [56])0x0;
                    PVar325 = Ray::operator()((Ray *)&Le,(Float)local_7a8._0_4_);
                    local_710 = PVar325.super_Tuple3<pbrt::Point3,_float>.z;
                    auVar124._0_8_ = PVar325.super_Tuple3<pbrt::Point3,_float>._0_8_;
                    auVar124._8_56_ = auVar293;
                    local_718 = (Interval)vmovlps_avx(auVar124._0_16_);
                    SVar327 = UniformGridMediumProvider::Density
                                        (*(UniformGridMediumProvider **)this_02,
                                         (Point3f *)&local_718,local_7b8);
                    auVar230._0_8_ = SVar327.values.values._8_8_;
                    auVar230._8_56_ = auVar189;
                    auVar125._0_8_ = SVar327.values.values._0_8_;
                    auVar125._8_56_ = auVar293;
                    d.values.values = (array<float,_4>)vmovlhps_avx(auVar125._0_16_,auVar230._0_16_)
                    ;
                    p.super_Tuple3<pbrt::Point3,_float>.z = local_710;
                    p.super_Tuple3<pbrt::Point3,_float>.x = local_718.low;
                    p.super_Tuple3<pbrt::Point3,_float>.y = local_718.high;
                    auVar293 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
                    uVar292 = 0;
                    SVar327 = UniformGridMediumProvider::Le
                                        (*(UniformGridMediumProvider **)this_02,p,local_7b8);
                    auVar231._0_8_ = SVar327.values.values._8_8_;
                    auVar231._8_56_ = auVar293;
                    local_7c8._8_8_ = uVar292;
                    local_7c8._0_8_ = SVar327.values.values._0_8_;
                    SVar327 = SampledSpectrum::operator*((SampledSpectrum *)&bsdf,&d);
                    auVar232._0_8_ = SVar327.values.values._8_8_;
                    auVar232._8_56_ = auVar293;
                    uStack_180 = auVar293._0_8_;
                    auVar293 = ZEXT856(uStack_180);
                    local_248._8_8_ = uVar292;
                    SVar328 = SampledSpectrum::operator*((SampledSpectrum *)&bs,&d);
                    auVar233._0_8_ = SVar328.values.values._8_8_;
                    auVar233._8_56_ = auVar293;
                    local_248._0_8_ = SVar328.values.values._0_8_;
                    SampledSpectrum::operator*=((SampledSpectrum *)&bssrdf,&TmajAccum);
                    SampledSpectrum::SampledSpectrum(&rrBeta,1.0);
                    uVar50 = CONCAT44(rrBeta.values.values[3],rrBeta.values.values[2]);
                    TmajAccum.values.values[2] = rrBeta.values.values[2];
                    TmajAccum.values.values[3] = rrBeta.values.values[3];
                    TmajAccum.values.values[0] = rrBeta.values.values[0];
                    TmajAccum.values.values[1] = rrBeta.values.values[1];
                    PVar326 = Transform::operator()
                                        ((Transform *)(this_02 + 3),(Point3<float> *)&local_718);
                    fVar301 = PVar326.super_Tuple3<pbrt::Point3,_float>.z;
                    local_268._8_8_ = uVar50;
                    local_268._0_8_ = PVar326.super_Tuple3<pbrt::Point3,_float>._0_8_;
                    VVar323 = Normalize<float>((Vector3<float> *)(sigma_a_3.values.values + 3));
                    auVar298._8_4_ = 0x80000000;
                    auVar298._0_8_ = 0x8000000080000000;
                    auVar298._12_4_ = 0x80000000;
                    auVar309._4_4_ = fVar301;
                    auVar309._0_4_ = fVar301;
                    auVar309._8_4_ = fVar301;
                    auVar309._12_4_ = fVar301;
                    _local_440 = (undefined1  [16])sigma_maj.values.values;
                    uStack_490 = 0.0;
                    _uStack_48c = 0.0;
                    uStack_488 = 0.0;
                    uStack_484 = 0.0;
                    auVar76._0_8_ =
                         VVar323.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
                    auVar76._8_8_ = uVar50 ^ auVar298._8_8_;
                    uStack_494 = -VVar323.super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar63 = vpermilps_avx(local_268,0x50);
                    uStack_480 = 0.0;
                    rrBeta.values.values._0_8_ = auVar63._0_8_;
                    rrBeta.values.values[2] = auVar63._8_4_;
                    rrBeta.values.values[3] = auVar63._12_4_;
                    uVar187 = vmovlps_avx(auVar309);
                    uStack_4a8 = (undefined4)uVar187;
                    uStack_4a4 = (undefined4)((ulong)uVar187 >> 0x20);
                    uStack_4a0 = auVar190._12_4_;
                    uVar187 = vmovlpd_avx(auVar76);
                    uStack_49c = (undefined4)uVar187;
                    uStack_498 = (undefined4)((ulong)uVar187 >> 0x20);
                    auVar81._16_16_ = auVar233._0_16_;
                    auVar81._0_16_ = auVar76;
                    local_478 = 0.0;
                    uStack_474 = 0;
                    auVar192._16_16_ = auVar232._0_16_;
                    auVar192._0_16_ = auVar76;
                    auVar83 = vperm2f128_avx(auVar192,auVar81,0x31);
                    auVar193._8_8_ = uVar292;
                    auVar193._0_8_ = SVar327.values.values._0_8_;
                    auVar193._16_16_ = local_248;
                    auVar83 = vunpcklpd_avx(auVar193,auVar83);
                    local_460 = auVar83._0_4_;
                    aNStack_438._8_16_ = vunpcklpd_avx(local_7c8,auVar231._0_16_);
                    aNStack_438[2].super_Tuple3<pbrt::Normal3,_float>._0_8_ =
                         bssrdf.super_TaggedPointer<pbrt::TabulatedBSSRDF>.bits;
                    auVar303 = ZEXT1664(auVar63);
                    auVar315 = ZEXT1664(auVar297);
                    auVar321 = ZEXT1664(auVar296);
                    bVar36 = Li::anon_class_120_15_cd2b6fed::operator()
                                       ((anon_class_120_15_cd2b6fed *)&rho,(MediumSample *)&rrBeta);
                    local_470 = TVar12.bits;
                    local_468 = TVar61.bits;
                    if (!bVar36) goto LAB_003cd24f;
                    fVar301 = (float)local_7a8._0_4_;
                  }
                  auVar198 = ZEXT464((uint)sigma_maj.values.values[0]);
                  local_7c8._0_4_ = fVar301;
                }
                SVar327 = SampledSpectrum::operator-(&sigma_maj);
                auVar234._0_8_ = SVar327.values.values._8_8_;
                auVar234._8_56_ = auVar189;
                auVar126._0_8_ = SVar327.values.values._0_8_;
                auVar126._8_56_ = auVar293;
                d.values.values = (array<float,_4>)vmovlhps_avx(auVar126._0_16_,auVar234._0_16_);
                auVar293 = (undefined1  [56])0x0;
                SVar327 = SampledSpectrum::operator*(&d,local_708 - (float)local_7c8._0_4_);
                auVar235._0_8_ = SVar327.values.values._8_8_;
                auVar235._8_56_ = auVar189;
                auVar127._0_8_ = SVar327.values.values._0_8_;
                auVar127._8_56_ = auVar293;
                _bssrdf = (array<float,_4>)vmovlhps_avx(auVar127._0_16_,auVar235._0_16_);
                auVar293 = ZEXT856(bssrdf._8_8_);
                SVar327 = FastExp((SampledSpectrum *)&bssrdf);
                auVar236._0_8_ = SVar327.values.values._8_8_;
                auVar236._8_56_ = auVar189;
                auVar296 = auVar236._0_16_;
                auVar128._0_8_ = SVar327.values.values._0_8_;
                auVar128._8_56_ = auVar293;
                auVar297 = auVar128._0_16_;
              }
              else {
                SVar327 = SampledSpectrum::operator-(&sigma_maj);
                auVar224._0_8_ = SVar327.values.values._8_8_;
                auVar224._8_56_ = auVar189;
                auVar118._0_8_ = SVar327.values.values._0_8_;
                auVar118._8_56_ = auVar293;
                d.values.values = (array<float,_4>)vmovlhps_avx(auVar118._0_16_,auVar224._0_16_);
                auVar293 = (undefined1  [56])0x0;
                SVar327 = SampledSpectrum::operator*(&d,local_708 - (float)local_7c8._0_4_);
                auVar225._0_8_ = SVar327.values.values._8_8_;
                auVar225._8_56_ = auVar189;
                auVar119._0_8_ = SVar327.values.values._0_8_;
                auVar119._8_56_ = auVar293;
                _bssrdf = (array<float,_4>)vmovlhps_avx(auVar119._0_16_,auVar225._0_16_);
                auVar293 = ZEXT856(bssrdf._8_8_);
                SVar327 = FastExp((SampledSpectrum *)&bssrdf);
                auVar226._0_8_ = SVar327.values.values._8_8_;
                auVar226._8_56_ = auVar189;
                auVar296 = auVar226._0_16_;
                auVar120._0_8_ = SVar327.values.values._0_8_;
                auVar120._8_56_ = auVar293;
                auVar297 = auVar120._0_16_;
              }
              auVar297 = vmovlhps_avx(auVar297,auVar296);
              rrBeta.values.values._0_8_ = auVar297._0_8_;
              rrBeta.values.values[2] = auVar297._8_4_;
              rrBeta.values.values[3] = auVar297._12_4_;
              SampledSpectrum::operator*=(&TmajAccum,&rrBeta);
              if ((tMax < fVar294) ||
                 (iVar38 = voxel[iVar53], voxel[iVar53] = iVar38 + step[iVar53],
                 iVar38 + step[iVar53] == voxelLimit[iVar53])) break;
              local_7c8._0_4_ = local_708;
              nextCrossingT[iVar53] = fVar294 + deltaT[iVar53];
              uVar50 = (ulong)(uint)pDVar3->lambda_min;
              iVar38 = *piVar2;
            }
LAB_003cd24f:
LAB_003cd27f:
            rrBeta.values.values[2] = TmajAccum.values.values[2];
            rrBeta.values.values[3] = TmajAccum.values.values[3];
            rrBeta.values.values._0_8_ = TmajAccum.values.values._0_8_;
          }
          else {
            SampledSpectrum::SampledSpectrum(&rrBeta,1.0);
          }
          goto LAB_003cd290;
        }
        rho.values.values._8_8_ = &terminated;
        rho.values.values._0_8_ = &T_hat;
        Le.values.values[2] = fStack_210;
        Le.values.values[3] = fStack_20c;
        Le.values.values._0_8_ = uVar187;
        tVar73 = Length<float>((Vector3<float> *)(Le.values.values + 3));
        fVar294 = tVar73 * (float)local_7c8._0_4_;
        auVar189 = (undefined1  [56])0x0;
        local_7c8 = ZEXT416((uint)fVar294);
        bVar36 = ABS(fVar294) == INFINITY;
        VVar323 = Normalize<float>((Vector3<float> *)(Le.values.values + 3));
        auVar102._0_8_ = VVar323.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar102._8_56_ = auVar189;
        uVar187 = vmovlpd_avx(auVar102._0_16_);
        Le.values.values[3] = (float)uVar187;
        fStack_588 = (float)((ulong)uVar187 >> 0x20);
        auVar189 = (undefined1  [56])0x0;
        local_7a8._0_4_ = this_02[3].lambda_min;
        SVar327 = DenselySampledSpectrum::Sample(this_02,local_7b8);
        auVar211._0_8_ = SVar327.values.values._8_8_;
        auVar211._8_56_ = auVar293;
        auVar103._0_8_ = SVar327.values.values._0_8_;
        auVar103._8_56_ = auVar189;
        auVar297 = vmovlhps_avx(auVar103._0_16_,auVar211._0_16_);
        rrBeta.values.values._0_8_ = auVar297._0_8_;
        rrBeta.values.values[2] = auVar297._8_4_;
        rrBeta.values.values[3] = auVar297._12_4_;
        auVar189 = (undefined1  [56])0x0;
        SVar327 = SampledSpectrum::operator*(&rrBeta,(Float)local_7a8._0_4_);
        auVar212._0_8_ = SVar327.values.values._8_8_;
        auVar212._8_56_ = auVar293;
        auVar104._0_8_ = SVar327.values.values._0_8_;
        auVar104._8_56_ = auVar189;
        auVar297 = vmovlhps_avx(auVar104._0_16_,auVar212._0_16_);
        sigma_a_3.values.values[0] = auVar297._0_4_;
        sigma_a_3.values.values[1] = auVar297._4_4_;
        sigma_a_3.values.values[2] = auVar297._8_4_;
        sigma_a_3.values.values[3] = auVar297._12_4_;
        auVar189 = (undefined1  [56])0x0;
        local_7a8._0_4_ = this_02[3].lambda_min;
        SVar327 = DenselySampledSpectrum::Sample(this_02 + 1,local_7b8);
        auVar213._0_8_ = SVar327.values.values._8_8_;
        auVar213._8_56_ = auVar293;
        auVar105._0_8_ = SVar327.values.values._0_8_;
        auVar105._8_56_ = auVar189;
        auVar297 = vmovlhps_avx(auVar105._0_16_,auVar213._0_16_);
        rrBeta.values.values._0_8_ = auVar297._0_8_;
        rrBeta.values.values[2] = auVar297._8_4_;
        rrBeta.values.values[3] = auVar297._12_4_;
        auVar189 = (undefined1  [56])0x0;
        local_7c8 = ZEXT416((uint)bVar36 * 0x7f7fffff + (uint)!bVar36 * local_7c8._0_4_);
        SVar327 = SampledSpectrum::operator*(&rrBeta,(Float)local_7a8._0_4_);
        auVar214._0_8_ = SVar327.values.values._8_8_;
        auVar214._8_56_ = auVar293;
        auVar106._0_8_ = SVar327.values.values._0_8_;
        auVar106._8_56_ = auVar189;
        auVar297 = vmovlhps_avx(auVar106._0_16_,auVar214._0_16_);
        auVar189 = ZEXT856(auVar297._8_8_);
        TmajAccum.values.values = (array<float,_4>)(array<float,_4>)auVar297;
        SVar327 = SampledSpectrum::operator+(&sigma_a_3,&TmajAccum);
        auVar215._0_8_ = SVar327.values.values._8_8_;
        auVar215._8_56_ = auVar293;
        auVar107._0_8_ = SVar327.values.values._0_8_;
        auVar107._8_56_ = auVar189;
        bsdf._0_16_ = vmovlhps_avx(auVar107._0_16_,auVar215._0_16_);
        fVar294 = SVar327.values.values[0];
        if ((fVar294 != 0.0) || (NAN(fVar294))) {
          auVar293 = ZEXT856(auVar189._0_8_);
          auVar166._0_4_ = SampleExponential((Float)local_788._0_4_,fVar294);
          auVar166._4_60_ = extraout_var;
          if (local_7c8._0_4_ <= auVar166._0_4_) {
            auVar19._8_4_ = 0x80000000;
            auVar19._0_8_ = 0x8000000080000000;
            auVar19._12_4_ = 0x80000000;
            in_ZmmResult._0_16_ = vxorps_avx512vl(local_7c8,auVar19);
            in_ZmmResult._16_48_ = auVar71;
            auVar189 = ZEXT856(in_ZmmResult._8_8_);
            SVar327 = SampledSpectrum::operator*((SampledSpectrum *)&bsdf,in_ZmmResult._0_4_);
            auVar279._0_8_ = SVar327.values.values._8_8_;
            auVar279._8_56_ = auVar293;
            auVar171._0_8_ = SVar327.values.values._0_8_;
            auVar171._8_56_ = auVar189;
            auVar190 = vmovlhps_avx(auVar171._0_16_,auVar279._0_16_);
            auVar189 = ZEXT856(auVar190._8_8_);
            rrBeta.values.values._0_8_ = auVar190._0_8_;
            rrBeta.values.values[2] = auVar190._8_4_;
            rrBeta.values.values[3] = auVar190._12_4_;
            SVar327 = FastExp(&rrBeta);
            auVar198._0_8_ = SVar327.values.values._8_8_;
            auVar198._8_56_ = auVar293;
            auVar172._0_8_ = SVar327.values.values._0_8_;
            auVar172._8_56_ = auVar189;
            auVar79 = auVar172._0_16_;
          }
          else {
            auVar189 = ZEXT856(extraout_var._4_8_);
            auVar18._8_4_ = 0x80000000;
            auVar18._0_8_ = 0x8000000080000000;
            auVar18._12_4_ = 0x80000000;
            in_ZmmResult._0_16_ = vxorps_avx512vl(auVar166._0_16_,auVar18);
            in_ZmmResult._16_48_ = auVar71;
            auVar293 = ZEXT856(in_ZmmResult._8_8_);
            local_788._0_16_ = auVar166._0_16_;
            SVar327 = SampledSpectrum::operator*((SampledSpectrum *)&bsdf,in_ZmmResult._0_4_);
            auVar275._0_8_ = SVar327.values.values._8_8_;
            auVar275._8_56_ = auVar189;
            auVar167._0_8_ = SVar327.values.values._0_8_;
            auVar167._8_56_ = auVar293;
            auVar297 = vmovlhps_avx(auVar167._0_16_,auVar275._0_16_);
            uVar187 = auVar297._8_8_;
            rrBeta.values.values._0_8_ = auVar297._0_8_;
            rrBeta.values.values[2] = auVar297._8_4_;
            rrBeta.values.values[3] = auVar297._12_4_;
            SVar327 = FastExp(&rrBeta);
            auVar276._0_8_ = SVar327.values.values._8_8_;
            auVar276._8_56_ = auVar189;
            local_7c8._8_8_ = uVar187;
            local_7c8._0_8_ = SVar327.values.values._0_8_;
            local_7a8 = auVar276._0_16_;
            local_708 = (float)this_02[3].lambda_max;
            auVar293 = (undefined1  [56])0x0;
            SVar327 = DenselySampledSpectrum::Sample(this_02 + 2,local_7b8);
            auVar277._0_8_ = SVar327.values.values._8_8_;
            auVar277._8_56_ = auVar189;
            auVar168._0_8_ = SVar327.values.values._0_8_;
            auVar168._8_56_ = auVar293;
            auVar297 = vmovlhps_avx(auVar168._0_16_,auVar277._0_16_);
            rrBeta.values.values._0_8_ = auVar297._0_8_;
            rrBeta.values.values[2] = auVar297._8_4_;
            rrBeta.values.values[3] = auVar297._12_4_;
            uVar292._0_4_ = 0.0;
            uVar292._4_4_ = 0.0;
            SVar327 = SampledSpectrum::operator*(&rrBeta,local_708);
            auVar278._0_8_ = SVar327.values.values._8_8_;
            auVar278._8_56_ = auVar189;
            local_708 = SVar327.values.values[0];
            fStack_704 = SVar327.values.values[1];
            auVar293 = ZEXT856((ulong)local_788._8_8_);
            auStack_700 = (undefined1  [8])uVar292;
            PVar325 = Ray::operator()((Ray *)&Le,local_788._0_4_);
            auVar191._0_4_ = PVar325.super_Tuple3<pbrt::Point3,_float>.z;
            auVar169._0_8_ = PVar325.super_Tuple3<pbrt::Point3,_float>._0_8_;
            auVar169._8_56_ = auVar293;
            auVar297 = vshufps_avx(auVar169._0_16_,auVar169._0_16_,0x50);
            auVar191._4_4_ = auVar191._0_4_;
            auVar191._8_4_ = auVar191._0_4_;
            auVar191._12_4_ = auVar191._0_4_;
            local_470 = &this_02[0x66666666666].values.ptr;
            local_468 = (ulong)&this_02[3].values | 0x1000000000000;
            auVar299._0_8_ = CONCAT44(fStack_588,Le.values.values[3]) ^ 0x8000000080000000;
            auVar299._8_4_ = 0x80000000;
            auVar299._12_4_ = 0x80000000;
            uStack_494 = -VVar323.super_Tuple3<pbrt::Vector3,_float>.z;
            auVar303 = ZEXT464((uint)auVar190._12_4_);
            local_440 = bsdf.bxdf.
                        super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                        .bits;
            aNStack_438[0].super_Tuple3<pbrt::Normal3,_float>.x =
                 bsdf.ng.super_Tuple3<pbrt::Normal3,_float>.x;
            aNStack_438[0].super_Tuple3<pbrt::Normal3,_float>.y =
                 bsdf.ng.super_Tuple3<pbrt::Normal3,_float>.y;
            uStack_490 = 0.0;
            auVar315 = ZEXT864(0) << 0x20;
            uStack_480 = 0.0;
            _uStack_48c = 0.0;
            uStack_488 = 0.0;
            uStack_484 = 0.0;
            rrBeta.values.values._0_8_ = auVar297._0_8_;
            rrBeta.values.values[2] = auVar297._8_4_;
            rrBeta.values.values[3] = auVar297._12_4_;
            auVar20._4_4_ = fStack_704;
            auVar20._0_4_ = local_708;
            auVar20._8_8_ = auStack_700;
            uVar187 = vmovlps_avx(auVar191);
            uStack_4a8 = (undefined4)uVar187;
            uStack_4a4 = (undefined4)((ulong)uVar187 >> 0x20);
            uStack_4a0 = auVar190._12_4_;
            uVar187 = vmovlps_avx(auVar299);
            uStack_49c = (undefined4)uVar187;
            uStack_498 = (undefined4)((ulong)uVar187 >> 0x20);
            local_478 = 0.0;
            uStack_474 = 0;
            local_460 = sigma_a_3.values.values[0];
            aNStack_438._8_16_ = vunpcklpd_avx(auVar20,auVar278._0_16_);
            aNStack_438._24_16_ = vunpcklpd_avx(local_7c8,local_7a8);
            Li::anon_class_120_15_cd2b6fed::operator()
                      ((anon_class_120_15_cd2b6fed *)&rho,(MediumSample *)&rrBeta);
            SampledSpectrum::SampledSpectrum(&bssrdfSample.Sp,1.0);
            auVar79._8_8_ = 0;
            auVar79._0_4_ = bssrdfSample.Sp.values.values[0];
            auVar79._4_4_ = bssrdfSample.Sp.values.values[1];
            auVar198 = ZEXT864(CONCAT44(bssrdfSample.Sp.values.values[3],
                                        bssrdfSample.Sp.values.values[2]));
          }
        }
        else {
          auVar17._8_4_ = 0x80000000;
          auVar17._0_8_ = 0x8000000080000000;
          auVar17._12_4_ = 0x80000000;
          in_ZmmResult._0_16_ = vxorps_avx512vl(local_7c8,auVar17);
          in_ZmmResult._16_48_ = auVar71;
          auVar189 = ZEXT856(in_ZmmResult._8_8_);
          SVar327 = SampledSpectrum::operator*((SampledSpectrum *)&bsdf,in_ZmmResult._0_4_);
          auVar216._0_8_ = SVar327.values.values._8_8_;
          auVar216._8_56_ = auVar293;
          auVar108._0_8_ = SVar327.values.values._0_8_;
          auVar108._8_56_ = auVar189;
          auVar190 = vmovlhps_avx(auVar108._0_16_,auVar216._0_16_);
          auVar189 = ZEXT856(auVar190._8_8_);
          rrBeta.values.values._0_8_ = auVar190._0_8_;
          rrBeta.values.values[2] = auVar190._8_4_;
          rrBeta.values.values[3] = auVar190._12_4_;
          SVar327 = FastExp(&rrBeta);
          auVar198._0_8_ = SVar327.values.values._8_8_;
          auVar198._8_56_ = auVar293;
          auVar109._0_8_ = SVar327.values.values._0_8_;
          auVar109._8_56_ = auVar189;
          auVar79 = auVar109._0_16_;
        }
      }
      else {
        this_01 = (Transform *)(this_02 + 3);
        if ((TVar12.bits & 0xfffe000000000000) == 0x2000000000000) {
          rho.values.values._8_8_ = &terminated;
          rho.values.values._0_8_ = &T_hat;
          sigma_a_3.values.values[2] = fStack_210;
          sigma_a_3.values.values[3] = fStack_20c;
          local_7ac = (float)local_7c8._0_4_;
          sigma_a_3.values.values[0] = (float)uVar187;
          sigma_a_3.values.values[1] = uVar187._4_4_;
          SampledSpectrum::SampledSpectrum(&TmajAccum,1.0);
          Transform::ApplyInverse((Ray *)&Le,this_01,(Ray *)&sigma_a_3,&local_7ac);
          tVar73 = Length<float>((Vector3<float> *)(Le.values.values + 3));
          local_7ac = tVar73 * local_7ac;
          auVar189 = (undefined1  [56])0x0;
          VVar323 = Normalize<float>((Vector3<float> *)(Le.values.values + 3));
          auVar93._0_8_ = VVar323.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar93._8_56_ = auVar189;
          uVar187 = vmovlps_avx(auVar93._0_16_);
          Le.values.values[3] = (float)uVar187;
          fStack_588 = (float)((ulong)uVar187 >> 0x20);
          pvVar1 = &this_02->values;
          bVar36 = Bounds3<float>::IntersectP
                             ((Bounds3<float> *)pvVar1,(Point3f *)&Le,
                              (Vector3f *)(Le.values.values + 3),local_7ac,&tMin,&tMax);
          auVar322 = auVar321._4_12_;
          auVar71 = in_ZmmResult._16_48_;
          auVar316 = auVar315._4_12_;
          auVar304 = auVar303._4_12_;
          if (bVar36) {
            auVar189 = (undefined1  [56])0x0;
            local_7c8._0_4_ = *(Float *)&this_02[2].values.nStored;
            SVar327 = DenselySampledSpectrum::Sample
                                ((DenselySampledSpectrum *)&(this_02->values).nStored,local_7b8);
            auVar205._0_8_ = SVar327.values.values._8_8_;
            auVar205._8_56_ = auVar293;
            auVar94._0_8_ = SVar327.values.values._0_8_;
            auVar94._8_56_ = auVar189;
            auVar297 = vmovlhps_avx(auVar94._0_16_,auVar205._0_16_);
            rrBeta.values.values._0_8_ = auVar297._0_8_;
            rrBeta.values.values[2] = auVar297._8_4_;
            rrBeta.values.values[3] = auVar297._12_4_;
            auVar189 = (undefined1  [56])0x0;
            SVar327 = SampledSpectrum::operator*(&rrBeta,(Float)local_7c8._0_4_);
            auVar206._0_8_ = SVar327.values.values._8_8_;
            auVar206._8_56_ = auVar293;
            auVar95._0_8_ = SVar327.values.values._0_8_;
            auVar95._8_56_ = auVar189;
            bsdf._0_16_ = vmovlhps_avx(auVar95._0_16_,auVar206._0_16_);
            local_7c8._0_4_ = *(undefined4 *)&this_02[2].values.nStored;
            auVar189 = (undefined1  [56])0x0;
            SVar327 = DenselySampledSpectrum::Sample
                                ((DenselySampledSpectrum *)&this_02[1].values.nStored,local_7b8);
            auVar207._0_8_ = SVar327.values.values._8_8_;
            auVar207._8_56_ = auVar293;
            auVar96._0_8_ = SVar327.values.values._0_8_;
            auVar96._8_56_ = auVar189;
            auVar297 = vmovlhps_avx(auVar96._0_16_,auVar207._0_16_);
            rrBeta.values.values._0_8_ = auVar297._0_8_;
            rrBeta.values.values[2] = auVar297._8_4_;
            rrBeta.values.values[3] = auVar297._12_4_;
            auVar189 = (undefined1  [56])0x0;
            SVar327 = SampledSpectrum::operator*(&rrBeta,(Float)local_7c8._0_4_);
            auVar208._0_8_ = SVar327.values.values._8_8_;
            auVar208._8_56_ = auVar293;
            auVar97._0_8_ = SVar327.values.values._0_8_;
            auVar97._8_56_ = auVar189;
            bs.optionalValue._0_16_ = vmovlhps_avx(auVar97._0_16_,auVar208._0_16_);
            auVar189 = ZEXT856(bs.optionalValue._8_8_);
            SVar327 = SampledSpectrum::operator+((SampledSpectrum *)&bsdf,(SampledSpectrum *)&bs);
            auVar209._0_8_ = SVar327.values.values._8_8_;
            auVar209._8_56_ = auVar293;
            auVar98._0_8_ = SVar327.values.values._0_8_;
            auVar98._8_56_ = auVar189;
            sigma_t.values.values = (array<float,_4>)vmovlhps_avx(auVar98._0_16_,auVar209._0_16_);
            auVar293 = ZEXT856(sigma_t.values.values._8_8_);
            VVar324 = Bounds3<float>::Diagonal((Bounds3<float> *)pvVar1);
            auVar291 = auVar209._4_60_;
            local_7c8._0_4_ = VVar324.super_Tuple3<pbrt::Vector3,_float>.z;
            auVar99._0_8_ = VVar324.super_Tuple3<pbrt::Vector3,_float>._0_8_;
            auVar99._8_56_ = auVar293;
            local_7a8 = auVar99._0_16_;
            VVar324 = Bounds3<float>::Offset((Bounds3<float> *)pvVar1,(Point3<float> *)&Le);
            bssrdfSample.Sp.values.values[2] = VVar324.super_Tuple3<pbrt::Vector3,_float>.z;
            auVar100._0_8_ = VVar324.super_Tuple3<pbrt::Vector3,_float>._0_8_;
            auVar100._8_56_ = auVar293;
            auVar296._4_4_ = fStack_588;
            auVar296._0_4_ = Le.values.values[3];
            auVar296._8_8_ = 0;
            bssrdfSample.Sp.values.values._0_8_ = vmovlps_avx(auVar100._0_16_);
            auVar293 = (undefined1  [56])0x0;
            auVar297 = vdivps_avx(auVar296,local_7a8);
            bssrdfSample._20_4_ =
                 VVar323.super_Tuple3<pbrt::Vector3,_float>.z / (float)local_7c8._0_4_;
            uVar187 = vmovlps_avx(auVar297);
            bssrdfSample.Sp.values.values[3] = (float)uVar187;
            bssrdfSample.pdf = (Float)((ulong)uVar187 >> 0x20);
            bssrdfSample.Sw.bxdf.
            super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
            .bits._0_4_ = 0;
            bssrdfSample.Sw.ng.super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
            bssrdfSample.Sw.ng.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
            PVar325 = Ray::operator()((Ray *)&bssrdfSample,tMin);
            auVar210._0_4_ = PVar325.super_Tuple3<pbrt::Point3,_float>.z;
            auVar210._4_60_ = auVar291;
            auVar101._0_8_ = PVar325.super_Tuple3<pbrt::Point3,_float>._0_8_;
            auVar101._8_56_ = auVar293;
            piVar2 = &this_02[7].lambda_max;
            uVar51 = this_02[7].lambda_min;
            uVar50 = CONCAT44(0,uVar51);
            auVar296 = vmovshdup_avx(auVar101._0_16_);
            auVar308 = ZEXT816(0) << 0x40;
            pDVar3 = this_02 + 7;
            lVar57 = 0;
            iVar38 = this_02[7].lambda_max;
            local_7a8._0_8_ = uVar50;
            fVar301 = (float)iVar38;
            auVar307._0_4_ = (float)(iVar38 + -1);
            auVar307._4_12_ = auVar304;
            auVar63 = ZEXT416((uint)(auVar296._0_4_ * fVar301));
            auVar297 = vminss_avx(auVar307,auVar63);
            uVar187 = vcmpss_avx512f(auVar63,auVar308,1);
            fVar302 = (float)(int)uVar51;
            auVar303 = ZEXT1664(CONCAT124(auVar316,fVar302));
            auVar313._0_4_ = (float)(int)(uVar51 - 1);
            auVar313._4_12_ = auVar316;
            iVar53 = *(int *)&this_02[7].values.alloc.memoryResource;
            iVar45 = (int)(float)((uint)!(bool)((byte)uVar187 & 1) * auVar297._0_4_);
            auVar63 = ZEXT416((uint)(PVar325.super_Tuple3<pbrt::Point3,_float>.x * fVar302));
            auVar297 = vminss_avx(auVar313,auVar63);
            uVar187 = vcmpss_avx512f(auVar63,auVar308,1);
            fVar305 = (float)iVar53;
            auVar319._0_4_ = (float)(iVar53 + -1);
            auVar319._4_12_ = auVar322;
            auVar68._16_48_ = auVar71;
            auVar68._0_16_ = auVar297;
            fVar294 = (float)((uint)!(bool)((byte)uVar187 & 1) * auVar297._0_4_);
            auVar67._4_60_ = auVar68._4_60_;
            auVar67._0_4_ = fVar294;
            auVar63 = auVar67._0_16_;
            iVar53 = (int)fVar294;
            auVar297 = vminss_avx(auVar319,ZEXT416((uint)(auVar210._0_4_ * fVar305)));
            uVar187 = vcmpss_avx512f(ZEXT416((uint)(auVar210._0_4_ * fVar305)),auVar308,1);
            auVar69._16_48_ = auVar71;
            auVar69._0_16_ = auVar297;
            fVar294 = (float)((uint)!(bool)((byte)uVar187 & 1) * auVar297._0_4_);
            in_ZmmResult._4_60_ = auVar69._4_60_;
            in_ZmmResult._0_4_ = fVar294;
            iVar55 = (int)fVar294;
            auVar321 = ZEXT464((uint)tMin);
            local_7c8._0_4_ = tMin;
            while( true ) {
              auVar315 = ZEXT1664(auVar63);
              if (lVar57 == 3) break;
              iVar56 = (int)lVar57;
              if (iVar56 == 1) {
                voxel[1] = iVar45;
                piVar58 = voxelLimit + 1;
                piVar59 = step + 1;
                pFVar52 = deltaT + 1;
                pfVar48 = nextCrossingT + 1;
                pfVar60 = &bssrdfSample.pdf;
                iVar49 = iVar45;
              }
              else if (iVar56 == 0) {
                voxel[lVar57] = iVar53;
                piVar58 = voxelLimit;
                piVar59 = step;
                pFVar52 = deltaT;
                pfVar48 = nextCrossingT;
                pfVar60 = bssrdfSample.Sp.values.values + 3;
                iVar49 = iVar53;
              }
              else {
                piVar58 = voxelLimit + 2;
                piVar59 = step + 2;
                pFVar52 = deltaT + 2;
                pfVar48 = nextCrossingT + 2;
                pfVar60 = (float *)&bssrdfSample.field_0x14;
                voxel[lVar57] = iVar55;
                iVar49 = iVar55;
              }
              if ((*pfVar60 == 0.0) && (!NAN(*pfVar60))) {
                pfVar60 = bssrdfSample.Sp.values.values + 3;
                if ((iVar56 != 0) && (pfVar60 = &bssrdfSample.pdf, iVar56 != 1)) {
                  pfVar60 = (float *)&bssrdfSample.field_0x14;
                }
                *pfVar60 = 0.0;
              }
              pfVar60 = bssrdfSample.Sp.values.values + 3;
              if ((iVar56 != 0) && (pfVar60 = &bssrdfSample.pdf, iVar56 != 1)) {
                pfVar60 = (float *)&bssrdfSample.field_0x14;
              }
              if (0.0 <= *pfVar60) {
                pfVar60 = bssrdfSample.Sp.values.values + 3;
                pDVar47 = pDVar3;
                fVar294 = fVar302;
                fVar317 = PVar325.super_Tuple3<pbrt::Point3,_float>.x;
                if ((iVar56 != 0) &&
                   (pfVar60 = &bssrdfSample.pdf, pDVar47 = (DenselySampledSpectrum *)piVar2,
                   fVar294 = fVar301, fVar317 = auVar296._0_4_, iVar56 != 1)) {
                  pfVar60 = (float *)&bssrdfSample.field_0x14;
                  pDVar47 = (DenselySampledSpectrum *)&this_02[7].values;
                  fVar294 = fVar305;
                  fVar317 = auVar210._0_4_;
                }
                *piVar59 = 1;
                fVar5 = *pfVar60;
                fVar317 = ((float)(iVar49 + 1) / fVar294 - fVar317) / fVar5 + tMin;
                auVar321 = ZEXT464((uint)fVar317);
                *pfVar48 = fVar317;
                *pFVar52 = 1.0 / (fVar5 * fVar294);
                iVar56 = pDVar47->lambda_min;
              }
              else {
                pfVar60 = bssrdfSample.Sp.values.values + 3;
                auVar321 = ZEXT1664(auVar101._0_16_);
                pDVar47 = pDVar3;
                fVar294 = fVar302;
                if (iVar56 != 0) {
                  pfVar60 = &bssrdfSample.pdf;
                  auVar321 = ZEXT1664(auVar296);
                  pDVar47 = (DenselySampledSpectrum *)piVar2;
                  fVar294 = fVar301;
                  if (iVar56 != 1) {
                    pfVar60 = (float *)&bssrdfSample.field_0x14;
                    auVar321 = ZEXT1664(auVar210._0_16_);
                    pDVar47 = (DenselySampledSpectrum *)&this_02[7].values;
                    fVar294 = fVar305;
                  }
                }
                fVar317 = *pfVar60;
                *pfVar48 = ((float)iVar49 / fVar294 - auVar321._0_4_) / fVar317 + tMin;
                iVar56 = pDVar47->lambda_min;
                *piVar59 = -1;
                *pFVar52 = -1.0 / (fVar317 * (float)iVar56);
                iVar56 = -1;
              }
              auVar63 = ZEXT416(0);
              *piVar58 = iVar56;
              lVar57 = lVar57 + 1;
            }
            TVar61.bits = (ulong)((long)&this_02[2].values.nStored + 4U) | 0x1000000000000;
            while( true ) {
              iVar53 = *(int *)(&DAT_02853da0 +
                               (ulong)((uint)(nextCrossingT[1] < nextCrossingT[2]) |
                                      (uint)(nextCrossingT[0] < nextCrossingT[1]) * 4 +
                                      (uint)(nextCrossingT[0] < nextCrossingT[2]) * 2) * 4);
              fVar294 = nextCrossingT[iVar53];
              auVar189 = (undefined1  [56])0x0;
              auVar297 = vminss_avx(ZEXT416((uint)fVar294),ZEXT416((uint)tMax));
              local_708 = auVar297._0_4_;
              auVar293 = (undefined1  [56])0x0;
              SVar327 = SampledSpectrum::operator*
                                  (&sigma_t,this_02[6].values.ptr
                                            [(long)((iVar38 * voxel[2] + voxel[1]) * (int)uVar50) +
                                             (long)voxel[0]]);
              auVar237._0_8_ = SVar327.values.values._8_8_;
              auVar237._8_56_ = auVar189;
              auVar129._0_8_ = SVar327.values.values._0_8_;
              auVar129._8_56_ = auVar293;
              auVar198 = ZEXT1664(auVar129._0_16_);
              sigma_maj.values.values =
                   (array<float,_4>)vmovlhps_avx(auVar129._0_16_,auVar237._0_16_);
              auVar293 = ZEXT856(sigma_maj.values.values._8_8_);
              if ((SVar327.values.values[0] != 0.0) || (NAN(SVar327.values.values[0]))) {
                while( true ) {
                  FVar72 = SampleExponential((Float)local_788._0_4_,auVar198._0_4_);
                  local_7a8._0_4_ = FVar72;
                  fVar301 = RNG::Uniform<float>(&rng);
                  auVar296 = auVar321._0_16_;
                  auVar297 = auVar315._0_16_;
                  local_788._0_4_ = fVar301;
                  auVar293 = (undefined1  [56])0x0;
                  fVar301 = (float)local_7a8._0_4_ + (float)local_7c8._0_4_;
                  auVar189 = (undefined1  [56])0x0;
                  if (local_708 <= fVar301) break;
                  auVar293 = (undefined1  [56])0x0;
                  if (fVar301 < tMax) {
                    local_7a8._0_4_ = fVar301;
                    SVar327 = SampledSpectrum::operator-(&sigma_maj);
                    auVar241._0_8_ = SVar327.values.values._8_8_;
                    auVar241._8_56_ = auVar189;
                    auVar133._0_8_ = SVar327.values.values._0_8_;
                    auVar133._8_56_ = auVar293;
                    d.values.values = (array<float,_4>)vmovlhps_avx(auVar133._0_16_,auVar241._0_16_)
                    ;
                    auVar293 = (undefined1  [56])0x0;
                    SVar327 = SampledSpectrum::operator*
                                        (&d,(float)local_7a8._0_4_ - (float)local_7c8._0_4_);
                    auVar242._0_8_ = SVar327.values.values._8_8_;
                    auVar242._8_56_ = auVar189;
                    auVar134._0_8_ = SVar327.values.values._0_8_;
                    auVar134._8_56_ = auVar293;
                    auVar63 = vmovlhps_avx(auVar134._0_16_,auVar242._0_16_);
                    auVar293 = ZEXT856(auVar63._8_8_);
                    rrBeta.values.values._0_8_ = auVar63._0_8_;
                    rrBeta.values.values[2] = auVar63._8_4_;
                    rrBeta.values.values[3] = auVar63._12_4_;
                    SVar327 = FastExp(&rrBeta);
                    auVar243._0_8_ = SVar327.values.values._8_8_;
                    auVar243._8_56_ = auVar189;
                    auVar135._0_8_ = SVar327.values.values._0_8_;
                    auVar135._8_56_ = auVar293;
                    _bssrdf = (array<float,_4>)vmovlhps_avx(auVar135._0_16_,auVar243._0_16_);
                    auVar293 = (undefined1  [56])0x0;
                    PVar325 = Ray::operator()((Ray *)&Le,(Float)local_7a8._0_4_);
                    local_710 = PVar325.super_Tuple3<pbrt::Point3,_float>.z;
                    auVar136._0_8_ = PVar325.super_Tuple3<pbrt::Point3,_float>._0_8_;
                    auVar136._8_56_ = auVar293;
                    local_718 = (Interval)vmovlps_avx(auVar136._0_16_);
                    SVar327 = CloudMediumProvider::Density
                                        (*(CloudMediumProvider **)this_02,PVar325,local_7b8);
                    auVar244._0_8_ = SVar327.values.values._8_8_;
                    auVar244._8_56_ = auVar189;
                    auVar137._0_8_ = SVar327.values.values._0_8_;
                    auVar137._8_56_ = auVar293;
                    d.values.values = (array<float,_4>)vmovlhps_avx(auVar137._0_16_,auVar244._0_16_)
                    ;
                    PVar325.super_Tuple3<pbrt::Point3,_float>.z = local_710;
                    PVar325.super_Tuple3<pbrt::Point3,_float>.x = local_718.low;
                    PVar325.super_Tuple3<pbrt::Point3,_float>.y = local_718.high;
                    auVar293 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
                    uVar292 = 0;
                    SVar327 = CloudMediumProvider::Le
                                        (*(CloudMediumProvider **)this_02,PVar325,local_7b8);
                    auVar245._0_8_ = SVar327.values.values._8_8_;
                    auVar245._8_56_ = auVar293;
                    local_7c8._8_8_ = uVar292;
                    local_7c8._0_8_ = SVar327.values.values._0_8_;
                    SVar327 = SampledSpectrum::operator*((SampledSpectrum *)&bsdf,&d);
                    auVar246._0_8_ = SVar327.values.values._8_8_;
                    auVar246._8_56_ = auVar293;
                    auVar293 = ZEXT856(auVar293._0_8_);
                    local_258._8_8_ = uVar292;
                    SVar328 = SampledSpectrum::operator*((SampledSpectrum *)&bs,&d);
                    auVar247._0_8_ = SVar328.values.values._8_8_;
                    auVar247._8_56_ = auVar293;
                    local_258._0_8_ = SVar328.values.values._0_8_;
                    SampledSpectrum::operator*=((SampledSpectrum *)&bssrdf,&TmajAccum);
                    SampledSpectrum::SampledSpectrum(&rrBeta,1.0);
                    uVar50 = CONCAT44(rrBeta.values.values[3],rrBeta.values.values[2]);
                    TmajAccum.values.values[2] = rrBeta.values.values[2];
                    TmajAccum.values.values[3] = rrBeta.values.values[3];
                    TmajAccum.values.values[0] = rrBeta.values.values[0];
                    TmajAccum.values.values[1] = rrBeta.values.values[1];
                    PVar326 = Transform::operator()(this_01,(Point3<float> *)&local_718);
                    fVar301 = PVar326.super_Tuple3<pbrt::Point3,_float>.z;
                    local_278._8_8_ = uVar50;
                    local_278._0_8_ = PVar326.super_Tuple3<pbrt::Point3,_float>._0_8_;
                    VVar323 = Normalize<float>((Vector3<float> *)(sigma_a_3.values.values + 3));
                    auVar63._8_4_ = 0x80000000;
                    auVar63._0_8_ = 0x8000000080000000;
                    auVar63._12_4_ = 0x80000000;
                    auVar310._4_4_ = fVar301;
                    auVar310._0_4_ = fVar301;
                    auVar310._8_4_ = fVar301;
                    auVar310._12_4_ = fVar301;
                    _local_440 = (undefined1  [16])sigma_maj.values.values;
                    uStack_490 = 0.0;
                    _uStack_48c = 0.0;
                    uStack_488 = 0.0;
                    uStack_484 = 0.0;
                    auVar77._0_8_ =
                         VVar323.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
                    auVar77._8_8_ = uVar50 ^ auVar63._8_8_;
                    uStack_494 = -VVar323.super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar63 = vpermilps_avx(local_278,0x50);
                    uStack_480 = 0.0;
                    rrBeta.values.values._0_8_ = auVar63._0_8_;
                    rrBeta.values.values[2] = auVar63._8_4_;
                    rrBeta.values.values[3] = auVar63._12_4_;
                    uVar187 = vmovlps_avx(auVar310);
                    uStack_4a8 = (undefined4)uVar187;
                    uStack_4a4 = (undefined4)((ulong)uVar187 >> 0x20);
                    uStack_4a0 = auVar190._12_4_;
                    uVar187 = vmovlpd_avx(auVar77);
                    uStack_49c = (undefined4)uVar187;
                    uStack_498 = (undefined4)((ulong)uVar187 >> 0x20);
                    auVar82._16_16_ = auVar247._0_16_;
                    auVar82._0_16_ = auVar77;
                    local_478 = 0.0;
                    uStack_474 = 0;
                    auVar194._16_16_ = auVar246._0_16_;
                    auVar194._0_16_ = auVar77;
                    auVar83 = vperm2f128_avx(auVar194,auVar82,0x31);
                    auVar195._8_8_ = uVar292;
                    auVar195._0_8_ = SVar327.values.values._0_8_;
                    auVar195._16_16_ = local_258;
                    auVar83 = vunpcklpd_avx(auVar195,auVar83);
                    local_460 = auVar83._0_4_;
                    aNStack_438._8_16_ = vunpcklpd_avx(local_7c8,auVar245._0_16_);
                    aNStack_438[2].super_Tuple3<pbrt::Normal3,_float>._0_8_ =
                         bssrdf.super_TaggedPointer<pbrt::TabulatedBSSRDF>.bits;
                    auVar303 = ZEXT1664(auVar63);
                    auVar315 = ZEXT1664(auVar297);
                    auVar321 = ZEXT1664(auVar296);
                    bVar36 = Li::anon_class_120_15_cd2b6fed::operator()
                                       ((anon_class_120_15_cd2b6fed *)&rho,(MediumSample *)&rrBeta);
                    local_470 = TVar12.bits | 0x3000000000000;
                    local_468 = TVar61.bits;
                    if (!bVar36) goto LAB_003cd25a;
                    fVar301 = (float)local_7a8._0_4_;
                  }
                  auVar198 = ZEXT464((uint)sigma_maj.values.values[0]);
                  local_7c8._0_4_ = fVar301;
                }
                SVar327 = SampledSpectrum::operator-(&sigma_maj);
                auVar248._0_8_ = SVar327.values.values._8_8_;
                auVar248._8_56_ = auVar189;
                auVar138._0_8_ = SVar327.values.values._0_8_;
                auVar138._8_56_ = auVar293;
                d.values.values = (array<float,_4>)vmovlhps_avx(auVar138._0_16_,auVar248._0_16_);
                auVar293 = (undefined1  [56])0x0;
                SVar327 = SampledSpectrum::operator*(&d,local_708 - (float)local_7c8._0_4_);
                auVar249._0_8_ = SVar327.values.values._8_8_;
                auVar249._8_56_ = auVar189;
                auVar139._0_8_ = SVar327.values.values._0_8_;
                auVar139._8_56_ = auVar293;
                _bssrdf = (array<float,_4>)vmovlhps_avx(auVar139._0_16_,auVar249._0_16_);
                auVar293 = ZEXT856(bssrdf._8_8_);
                SVar327 = FastExp((SampledSpectrum *)&bssrdf);
                auVar250._0_8_ = SVar327.values.values._8_8_;
                auVar250._8_56_ = auVar189;
                auVar296 = auVar250._0_16_;
                auVar140._0_8_ = SVar327.values.values._0_8_;
                auVar140._8_56_ = auVar293;
                auVar297 = auVar140._0_16_;
              }
              else {
                SVar327 = SampledSpectrum::operator-(&sigma_maj);
                auVar238._0_8_ = SVar327.values.values._8_8_;
                auVar238._8_56_ = auVar189;
                auVar130._0_8_ = SVar327.values.values._0_8_;
                auVar130._8_56_ = auVar293;
                d.values.values = (array<float,_4>)vmovlhps_avx(auVar130._0_16_,auVar238._0_16_);
                auVar293 = (undefined1  [56])0x0;
                SVar327 = SampledSpectrum::operator*(&d,local_708 - (float)local_7c8._0_4_);
                auVar239._0_8_ = SVar327.values.values._8_8_;
                auVar239._8_56_ = auVar189;
                auVar131._0_8_ = SVar327.values.values._0_8_;
                auVar131._8_56_ = auVar293;
                _bssrdf = (array<float,_4>)vmovlhps_avx(auVar131._0_16_,auVar239._0_16_);
                auVar293 = ZEXT856(bssrdf._8_8_);
                SVar327 = FastExp((SampledSpectrum *)&bssrdf);
                auVar240._0_8_ = SVar327.values.values._8_8_;
                auVar240._8_56_ = auVar189;
                auVar296 = auVar240._0_16_;
                auVar132._0_8_ = SVar327.values.values._0_8_;
                auVar132._8_56_ = auVar293;
                auVar297 = auVar132._0_16_;
              }
              auVar297 = vmovlhps_avx(auVar297,auVar296);
              rrBeta.values.values._0_8_ = auVar297._0_8_;
              rrBeta.values.values[2] = auVar297._8_4_;
              rrBeta.values.values[3] = auVar297._12_4_;
              SampledSpectrum::operator*=(&TmajAccum,&rrBeta);
              if ((tMax < fVar294) ||
                 (iVar38 = voxel[iVar53], voxel[iVar53] = iVar38 + step[iVar53],
                 iVar38 + step[iVar53] == voxelLimit[iVar53])) break;
              local_7c8._0_4_ = local_708;
              nextCrossingT[iVar53] = fVar294 + deltaT[iVar53];
              uVar50 = (ulong)(uint)pDVar3->lambda_min;
              iVar38 = *piVar2;
            }
LAB_003cd25a:
            auVar198 = _TmajAccum;
            rrBeta.values.values[0] = TmajAccum.values.values[0];
            rrBeta.values.values[1] = TmajAccum.values.values[1];
            rrBeta.values.values[2] = auVar198._8_4_;
            rrBeta.values.values[3] = auVar198._12_4_;
            _TmajAccum = auVar198;
          }
          else {
            SampledSpectrum::SampledSpectrum(&rrBeta,1.0);
          }
        }
        else {
          rho.values.values._8_8_ = &terminated;
          rho.values.values._0_8_ = &T_hat;
          sigma_a_3.values.values[2] = fStack_210;
          sigma_a_3.values.values[3] = fStack_20c;
          local_7ac = (float)local_7c8._0_4_;
          sigma_a_3.values.values[0] = (float)uVar187;
          sigma_a_3.values.values[1] = uVar187._4_4_;
          SampledSpectrum::SampledSpectrum(&TmajAccum,1.0);
          Transform::ApplyInverse((Ray *)&Le,this_01,(Ray *)&sigma_a_3,&local_7ac);
          tVar73 = Length<float>((Vector3<float> *)(Le.values.values + 3));
          local_7ac = tVar73 * local_7ac;
          auVar189 = (undefined1  [56])0x0;
          VVar323 = Normalize<float>((Vector3<float> *)(Le.values.values + 3));
          auVar153._0_8_ = VVar323.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar153._8_56_ = auVar189;
          uVar187 = vmovlps_avx(auVar153._0_16_);
          Le.values.values[3] = (float)uVar187;
          fStack_588 = (float)((ulong)uVar187 >> 0x20);
          pvVar1 = &this_02->values;
          bVar36 = Bounds3<float>::IntersectP
                             ((Bounds3<float> *)pvVar1,(Point3f *)&Le,
                              (Vector3f *)(Le.values.values + 3),local_7ac,&tMin,&tMax);
          auVar71 = in_ZmmResult._16_48_;
          auVar316 = auVar321._4_12_;
          auVar304 = auVar303._4_12_;
          if (bVar36) {
            auVar189 = (undefined1  [56])0x0;
            local_7c8._0_4_ = *(Float *)&this_02[2].values.nStored;
            SVar327 = DenselySampledSpectrum::Sample
                                ((DenselySampledSpectrum *)&(this_02->values).nStored,local_7b8);
            auVar217._0_8_ = SVar327.values.values._8_8_;
            auVar217._8_56_ = auVar293;
            auVar303._0_8_ = SVar327.values.values._0_8_;
            auVar303._8_56_ = auVar189;
            auVar297 = vmovlhps_avx(auVar303._0_16_,auVar217._0_16_);
            rrBeta.values.values._0_8_ = auVar297._0_8_;
            rrBeta.values.values[2] = auVar297._8_4_;
            rrBeta.values.values[3] = auVar297._12_4_;
            auVar189 = (undefined1  [56])0x0;
            SVar327 = SampledSpectrum::operator*(&rrBeta,(Float)local_7c8._0_4_);
            auVar218._0_8_ = SVar327.values.values._8_8_;
            auVar218._8_56_ = auVar293;
            auVar110._0_8_ = SVar327.values.values._0_8_;
            auVar110._8_56_ = auVar189;
            bsdf._0_16_ = vmovlhps_avx(auVar110._0_16_,auVar218._0_16_);
            local_7c8._0_4_ = *(undefined4 *)&this_02[2].values.nStored;
            auVar189 = (undefined1  [56])0x0;
            SVar327 = DenselySampledSpectrum::Sample
                                ((DenselySampledSpectrum *)&this_02[1].values.nStored,local_7b8);
            auVar219._0_8_ = SVar327.values.values._8_8_;
            auVar219._8_56_ = auVar293;
            auVar111._0_8_ = SVar327.values.values._0_8_;
            auVar111._8_56_ = auVar189;
            auVar297 = vmovlhps_avx(auVar111._0_16_,auVar219._0_16_);
            rrBeta.values.values._0_8_ = auVar297._0_8_;
            rrBeta.values.values[2] = auVar297._8_4_;
            rrBeta.values.values[3] = auVar297._12_4_;
            auVar189 = (undefined1  [56])0x0;
            SVar327 = SampledSpectrum::operator*(&rrBeta,(Float)local_7c8._0_4_);
            auVar220._0_8_ = SVar327.values.values._8_8_;
            auVar220._8_56_ = auVar293;
            auVar112._0_8_ = SVar327.values.values._0_8_;
            auVar112._8_56_ = auVar189;
            bs.optionalValue._0_16_ = vmovlhps_avx(auVar112._0_16_,auVar220._0_16_);
            auVar189 = ZEXT856(bs.optionalValue._8_8_);
            SVar327 = SampledSpectrum::operator+((SampledSpectrum *)&bsdf,(SampledSpectrum *)&bs);
            auVar221._0_8_ = SVar327.values.values._8_8_;
            auVar221._8_56_ = auVar293;
            auVar113._0_8_ = SVar327.values.values._0_8_;
            auVar113._8_56_ = auVar189;
            sigma_t.values.values = (array<float,_4>)vmovlhps_avx(auVar113._0_16_,auVar221._0_16_);
            auVar293 = ZEXT856(sigma_t.values.values._8_8_);
            VVar324 = Bounds3<float>::Diagonal((Bounds3<float> *)pvVar1);
            auVar291 = auVar221._4_60_;
            local_7c8._0_4_ = VVar324.super_Tuple3<pbrt::Vector3,_float>.z;
            auVar114._0_8_ = VVar324.super_Tuple3<pbrt::Vector3,_float>._0_8_;
            auVar114._8_56_ = auVar293;
            local_7a8 = auVar114._0_16_;
            VVar324 = Bounds3<float>::Offset((Bounds3<float> *)pvVar1,(Point3<float> *)&Le);
            bssrdfSample.Sp.values.values[2] = VVar324.super_Tuple3<pbrt::Vector3,_float>.z;
            auVar115._0_8_ = VVar324.super_Tuple3<pbrt::Vector3,_float>._0_8_;
            auVar115._8_56_ = auVar293;
            auVar297._4_4_ = fStack_588;
            auVar297._0_4_ = Le.values.values[3];
            auVar297._8_8_ = 0;
            bssrdfSample.Sp.values.values._0_8_ = vmovlps_avx(auVar115._0_16_);
            auVar293 = (undefined1  [56])0x0;
            auVar297 = vdivps_avx(auVar297,local_7a8);
            bssrdfSample._20_4_ =
                 VVar323.super_Tuple3<pbrt::Vector3,_float>.z / (float)local_7c8._0_4_;
            uVar187 = vmovlps_avx(auVar297);
            bssrdfSample.Sp.values.values[3] = (float)uVar187;
            bssrdfSample.pdf = (Float)((ulong)uVar187 >> 0x20);
            bssrdfSample.Sw.bxdf.
            super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
            .bits._0_4_ = 0;
            bssrdfSample.Sw.ng.super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
            bssrdfSample.Sw.ng.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
            PVar325 = Ray::operator()((Ray *)&bssrdfSample,tMin);
            auVar222._0_4_ = PVar325.super_Tuple3<pbrt::Point3,_float>.z;
            auVar222._4_60_ = auVar291;
            auVar116._0_8_ = PVar325.super_Tuple3<pbrt::Point3,_float>._0_8_;
            auVar116._8_56_ = auVar293;
            piVar2 = &this_02[7].lambda_max;
            uVar51 = this_02[7].lambda_min;
            uVar50 = CONCAT44(0,uVar51);
            auVar296 = vmovshdup_avx(auVar116._0_16_);
            auVar78 = ZEXT816(0) << 0x40;
            pDVar3 = this_02 + 7;
            lVar57 = 0;
            iVar38 = this_02[7].lambda_max;
            local_7a8._0_8_ = uVar50;
            fVar301 = (float)iVar38;
            auVar308._0_4_ = (float)(iVar38 + -1);
            auVar308._4_12_ = auVar304;
            auVar314._0_4_ = (float)(int)(uVar51 - 1);
            auVar314._4_12_ = auVar304;
            iVar53 = *(int *)&this_02[7].values.alloc.memoryResource;
            auVar63 = ZEXT416((uint)(auVar296._0_4_ * fVar301));
            auVar297 = vminss_avx(auVar308,auVar63);
            uVar187 = vcmpss_avx512f(auVar63,auVar78,1);
            fVar302 = (float)(int)uVar51;
            auVar303 = ZEXT1664(CONCAT124(auVar316,fVar302));
            iVar45 = (int)(float)((uint)!(bool)((byte)uVar187 & 1) * auVar297._0_4_);
            auVar63 = ZEXT416((uint)(PVar325.super_Tuple3<pbrt::Point3,_float>.x * fVar302));
            auVar297 = vminss_avx(auVar314,auVar63);
            uVar187 = vcmpss_avx512f(auVar63,auVar78,1);
            fVar305 = (float)iVar53;
            auVar320._0_4_ = (float)(iVar53 + -1);
            auVar320._4_12_ = auVar316;
            auVar315._16_48_ = auVar71;
            auVar315._0_16_ = auVar297;
            fVar294 = (float)((uint)!(bool)((byte)uVar187 & 1) * auVar297._0_4_);
            auVar321._4_60_ = auVar315._4_60_;
            auVar321._0_4_ = fVar294;
            auVar63 = auVar321._0_16_;
            iVar53 = (int)fVar294;
            auVar297 = vminss_avx(auVar320,ZEXT416((uint)(auVar222._0_4_ * fVar305)));
            uVar187 = vcmpss_avx512f(ZEXT416((uint)(auVar222._0_4_ * fVar305)),auVar78,1);
            auVar70._16_48_ = auVar71;
            auVar70._0_16_ = auVar297;
            fVar294 = (float)((uint)!(bool)((byte)uVar187 & 1) * auVar297._0_4_);
            in_ZmmResult._4_60_ = auVar70._4_60_;
            in_ZmmResult._0_4_ = fVar294;
            iVar55 = (int)fVar294;
            auVar321 = ZEXT464((uint)tMin);
            local_7c8._0_4_ = tMin;
            while( true ) {
              auVar315 = ZEXT1664(auVar63);
              pfVar48 = bssrdfSample.Sp.values.values + 3;
              if (lVar57 == 3) break;
              iVar56 = (int)lVar57;
              if (iVar56 == 1) {
                voxel[1] = iVar45;
                piVar58 = voxelLimit + 1;
                piVar59 = step + 1;
                pFVar52 = deltaT + 1;
                pfVar60 = nextCrossingT + 1;
                pFVar46 = &bssrdfSample.pdf;
                iVar49 = iVar45;
              }
              else if (iVar56 == 0) {
                voxel[lVar57] = iVar53;
                piVar58 = voxelLimit;
                piVar59 = step;
                pFVar52 = deltaT;
                pfVar60 = nextCrossingT;
                pFVar46 = pfVar48;
                iVar49 = iVar53;
              }
              else {
                piVar58 = voxelLimit + 2;
                piVar59 = step + 2;
                pFVar52 = deltaT + 2;
                pfVar60 = nextCrossingT + 2;
                pFVar46 = (Float *)&bssrdfSample.field_0x14;
                voxel[lVar57] = iVar55;
                iVar49 = iVar55;
              }
              if ((*pFVar46 == 0.0) && (!NAN(*pFVar46))) {
                pFVar46 = pfVar48;
                if ((iVar56 != 0) && (pFVar46 = &bssrdfSample.pdf, iVar56 != 1)) {
                  pFVar46 = (Float *)&bssrdfSample.field_0x14;
                }
                *pFVar46 = 0.0;
              }
              pFVar46 = pfVar48;
              if ((iVar56 != 0) && (pFVar46 = &bssrdfSample.pdf, iVar56 != 1)) {
                pFVar46 = (Float *)&bssrdfSample.field_0x14;
              }
              if (0.0 <= *pFVar46) {
                pDVar47 = pDVar3;
                fVar294 = fVar302;
                fVar317 = PVar325.super_Tuple3<pbrt::Point3,_float>.x;
                if ((iVar56 != 0) &&
                   (pfVar48 = &bssrdfSample.pdf, pDVar47 = (DenselySampledSpectrum *)piVar2,
                   fVar294 = fVar301, fVar317 = auVar296._0_4_, iVar56 != 1)) {
                  pfVar48 = (float *)&bssrdfSample.field_0x14;
                  pDVar47 = (DenselySampledSpectrum *)&this_02[7].values;
                  fVar294 = fVar305;
                  fVar317 = auVar222._0_4_;
                }
                *piVar59 = 1;
                fVar5 = *pfVar48;
                fVar317 = ((float)(iVar49 + 1) / fVar294 - fVar317) / fVar5 + tMin;
                auVar321 = ZEXT464((uint)fVar317);
                *pfVar60 = fVar317;
                *pFVar52 = 1.0 / (fVar5 * fVar294);
                iVar56 = pDVar47->lambda_min;
              }
              else {
                auVar321 = ZEXT1664(auVar116._0_16_);
                pDVar47 = pDVar3;
                fVar294 = fVar302;
                if (iVar56 != 0) {
                  pfVar48 = &bssrdfSample.pdf;
                  auVar321 = ZEXT1664(auVar296);
                  pDVar47 = (DenselySampledSpectrum *)piVar2;
                  fVar294 = fVar301;
                  if (iVar56 != 1) {
                    pfVar48 = (float *)&bssrdfSample.field_0x14;
                    auVar321 = ZEXT1664(auVar222._0_16_);
                    pDVar47 = (DenselySampledSpectrum *)&this_02[7].values;
                    fVar294 = fVar305;
                  }
                }
                fVar317 = *pfVar48;
                *pfVar60 = ((float)iVar49 / fVar294 - auVar321._0_4_) / fVar317 + tMin;
                iVar56 = pDVar47->lambda_min;
                *piVar59 = -1;
                *pFVar52 = -1.0 / (fVar317 * (float)iVar56);
                iVar56 = -1;
              }
              auVar63 = ZEXT416(0);
              *piVar58 = iVar56;
              lVar57 = lVar57 + 1;
            }
            TVar61.bits = (ulong)((long)&this_02[2].values.nStored + 4U) | 0x1000000000000;
            while( true ) {
              iVar53 = *(int *)(&DAT_02853da0 +
                               (ulong)((uint)(nextCrossingT[1] < nextCrossingT[2]) |
                                      (uint)(nextCrossingT[0] < nextCrossingT[1]) * 4 +
                                      (uint)(nextCrossingT[0] < nextCrossingT[2]) * 2) * 4);
              fVar294 = nextCrossingT[iVar53];
              auVar189 = (undefined1  [56])0x0;
              auVar297 = vminss_avx(ZEXT416((uint)fVar294),ZEXT416((uint)tMax));
              local_708 = auVar297._0_4_;
              auVar293 = (undefined1  [56])0x0;
              SVar327 = SampledSpectrum::operator*
                                  (&sigma_t,this_02[6].values.ptr
                                            [(long)((iVar38 * voxel[2] + voxel[1]) * (int)uVar50) +
                                             (long)voxel[0]]);
              auVar251._0_8_ = SVar327.values.values._8_8_;
              auVar251._8_56_ = auVar189;
              auVar141._0_8_ = SVar327.values.values._0_8_;
              auVar141._8_56_ = auVar293;
              auVar198 = ZEXT1664(auVar141._0_16_);
              sigma_maj.values.values =
                   (array<float,_4>)vmovlhps_avx(auVar141._0_16_,auVar251._0_16_);
              auVar293 = ZEXT856(sigma_maj.values.values._8_8_);
              if ((SVar327.values.values[0] != 0.0) || (NAN(SVar327.values.values[0]))) {
                while( true ) {
                  FVar72 = SampleExponential((Float)local_788._0_4_,auVar198._0_4_);
                  local_7a8._0_4_ = FVar72;
                  fVar301 = RNG::Uniform<float>(&rng);
                  auVar296 = auVar321._0_16_;
                  auVar297 = auVar315._0_16_;
                  local_788._0_4_ = fVar301;
                  auVar293 = (undefined1  [56])0x0;
                  fVar301 = (float)local_7a8._0_4_ + (float)local_7c8._0_4_;
                  auVar189 = (undefined1  [56])0x0;
                  if (local_708 <= fVar301) break;
                  auVar293 = (undefined1  [56])0x0;
                  if (fVar301 < tMax) {
                    local_7a8._0_4_ = fVar301;
                    SVar327 = SampledSpectrum::operator-(&sigma_maj);
                    auVar255._0_8_ = SVar327.values.values._8_8_;
                    auVar255._8_56_ = auVar189;
                    auVar145._0_8_ = SVar327.values.values._0_8_;
                    auVar145._8_56_ = auVar293;
                    d.values.values = (array<float,_4>)vmovlhps_avx(auVar145._0_16_,auVar255._0_16_)
                    ;
                    auVar293 = (undefined1  [56])0x0;
                    SVar327 = SampledSpectrum::operator*
                                        (&d,(float)local_7a8._0_4_ - (float)local_7c8._0_4_);
                    auVar256._0_8_ = SVar327.values.values._8_8_;
                    auVar256._8_56_ = auVar189;
                    auVar146._0_8_ = SVar327.values.values._0_8_;
                    auVar146._8_56_ = auVar293;
                    auVar63 = vmovlhps_avx(auVar146._0_16_,auVar256._0_16_);
                    auVar293 = ZEXT856(auVar63._8_8_);
                    rrBeta.values.values._0_8_ = auVar63._0_8_;
                    rrBeta.values.values[2] = auVar63._8_4_;
                    rrBeta.values.values[3] = auVar63._12_4_;
                    SVar327 = FastExp(&rrBeta);
                    auVar257._0_8_ = SVar327.values.values._8_8_;
                    auVar257._8_56_ = auVar189;
                    auVar147._0_8_ = SVar327.values.values._0_8_;
                    auVar147._8_56_ = auVar293;
                    _bssrdf = (array<float,_4>)vmovlhps_avx(auVar147._0_16_,auVar257._0_16_);
                    auVar293 = (undefined1  [56])0x0;
                    PVar325 = Ray::operator()((Ray *)&Le,(Float)local_7a8._0_4_);
                    local_710 = PVar325.super_Tuple3<pbrt::Point3,_float>.z;
                    auVar148._0_8_ = PVar325.super_Tuple3<pbrt::Point3,_float>._0_8_;
                    auVar148._8_56_ = auVar293;
                    local_718 = (Interval)vmovlps_avx(auVar148._0_16_);
                    SVar327 = NanoVDBMediumProvider::Density
                                        (*(NanoVDBMediumProvider **)this_02,(Point3f *)&local_718,
                                         local_7b8);
                    auVar258._0_8_ = SVar327.values.values._8_8_;
                    auVar258._8_56_ = auVar189;
                    auVar149._0_8_ = SVar327.values.values._0_8_;
                    auVar149._8_56_ = auVar293;
                    d.values.values = (array<float,_4>)vmovlhps_avx(auVar149._0_16_,auVar258._0_16_)
                    ;
                    uVar292 = d.values.values._8_8_;
                    SVar327 = NanoVDBMediumProvider::Le
                                        (*(NanoVDBMediumProvider **)this_02,(Point3f *)&local_718,
                                         local_7b8);
                    auVar259._0_8_ = SVar327.values.values._8_8_;
                    auVar259._8_56_ = auVar189;
                    local_7c8._8_8_ = uVar292;
                    local_7c8._0_8_ = SVar327.values.values._0_8_;
                    SVar327 = SampledSpectrum::operator*((SampledSpectrum *)&bsdf,&d);
                    auVar260._0_8_ = SVar327.values.values._8_8_;
                    auVar260._8_56_ = auVar189;
                    uStack_180 = auVar189._0_8_;
                    auVar293 = ZEXT856(uStack_180);
                    local_248._8_8_ = uVar292;
                    SVar328 = SampledSpectrum::operator*((SampledSpectrum *)&bs,&d);
                    auVar261._0_8_ = SVar328.values.values._8_8_;
                    auVar261._8_56_ = auVar293;
                    local_248._0_8_ = SVar328.values.values._0_8_;
                    SampledSpectrum::operator*=((SampledSpectrum *)&bssrdf,&TmajAccum);
                    SampledSpectrum::SampledSpectrum(&rrBeta,1.0);
                    uVar187 = CONCAT44(rrBeta.values.values[3],rrBeta.values.values[2]);
                    TmajAccum.values.values[2] = rrBeta.values.values[2];
                    TmajAccum.values.values[3] = rrBeta.values.values[3];
                    TmajAccum.values.values[0] = rrBeta.values.values[0];
                    TmajAccum.values.values[1] = rrBeta.values.values[1];
                    PVar326 = Transform::operator()(this_01,(Point3<float> *)&local_718);
                    fVar301 = PVar326.super_Tuple3<pbrt::Point3,_float>.z;
                    local_268._8_8_ = uVar187;
                    local_268._0_8_ = PVar326.super_Tuple3<pbrt::Point3,_float>._0_8_;
                    VVar323 = Normalize<float>((Vector3<float> *)(sigma_a_3.values.values + 3));
                    auVar311._4_4_ = fVar301;
                    auVar311._0_4_ = fVar301;
                    auVar311._8_4_ = fVar301;
                    auVar311._12_4_ = fVar301;
                    _local_440 = (undefined1  [16])sigma_maj.values.values;
                    uStack_490 = 0.0;
                    _uStack_48c = 0.0;
                    uStack_488 = 0.0;
                    uStack_484 = 0.0;
                    auVar78._0_8_ =
                         VVar323.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
                    auVar78._8_4_ = (uint)uVar187 ^ 0x80000000;
                    auVar78._12_4_ = (uint)((ulong)uVar187 >> 0x20) ^ 0x80000000;
                    uStack_494 = -VVar323.super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar63 = vpermilps_avx(local_268,0x50);
                    uStack_480 = 0.0;
                    rrBeta.values.values._0_8_ = auVar63._0_8_;
                    rrBeta.values.values[2] = auVar63._8_4_;
                    rrBeta.values.values[3] = auVar63._12_4_;
                    uVar187 = vmovlps_avx(auVar311);
                    uStack_4a8 = (undefined4)uVar187;
                    uStack_4a4 = (undefined4)((ulong)uVar187 >> 0x20);
                    uStack_4a0 = auVar190._12_4_;
                    uVar187 = vmovlps_avx(auVar78);
                    uStack_49c = (undefined4)uVar187;
                    uStack_498 = (undefined4)((ulong)uVar187 >> 0x20);
                    auVar83._16_16_ = auVar261._0_16_;
                    auVar83._0_16_ = auVar78;
                    local_478 = 0.0;
                    uStack_474 = 0;
                    auVar196._16_16_ = auVar260._0_16_;
                    auVar196._0_16_ = auVar78;
                    auVar83 = vperm2f128_avx(auVar196,auVar83,0x31);
                    auVar197._8_8_ = uVar292;
                    auVar197._0_8_ = SVar327.values.values._0_8_;
                    auVar197._16_16_ = local_248;
                    auVar83 = vunpcklpd_avx(auVar197,auVar83);
                    local_460 = auVar83._0_4_;
                    aNStack_438._8_16_ = vunpcklpd_avx(local_7c8,auVar259._0_16_);
                    aNStack_438[2].super_Tuple3<pbrt::Normal3,_float>._0_8_ =
                         bssrdf.super_TaggedPointer<pbrt::TabulatedBSSRDF>.bits;
                    auVar303 = ZEXT1664(auVar63);
                    auVar315 = ZEXT1664(auVar297);
                    auVar321 = ZEXT1664(auVar296);
                    bVar36 = Li::anon_class_120_15_cd2b6fed::operator()
                                       ((anon_class_120_15_cd2b6fed *)&rho,(MediumSample *)&rrBeta);
                    local_470 = (ulong)this_02 | 0x4000000000000;
                    local_468 = TVar61.bits;
                    if (!bVar36) goto LAB_003cd26e;
                    fVar301 = (float)local_7a8._0_4_;
                  }
                  auVar198 = ZEXT464((uint)sigma_maj.values.values[0]);
                  local_7c8._0_4_ = fVar301;
                }
                SVar327 = SampledSpectrum::operator-(&sigma_maj);
                auVar262._0_8_ = SVar327.values.values._8_8_;
                auVar262._8_56_ = auVar189;
                auVar150._0_8_ = SVar327.values.values._0_8_;
                auVar150._8_56_ = auVar293;
                d.values.values = (array<float,_4>)vmovlhps_avx(auVar150._0_16_,auVar262._0_16_);
                auVar293 = (undefined1  [56])0x0;
                SVar327 = SampledSpectrum::operator*(&d,local_708 - (float)local_7c8._0_4_);
                auVar263._0_8_ = SVar327.values.values._8_8_;
                auVar263._8_56_ = auVar189;
                auVar151._0_8_ = SVar327.values.values._0_8_;
                auVar151._8_56_ = auVar293;
                _bssrdf = (array<float,_4>)vmovlhps_avx(auVar151._0_16_,auVar263._0_16_);
                auVar293 = ZEXT856(bssrdf._8_8_);
                SVar327 = FastExp((SampledSpectrum *)&bssrdf);
                auVar264._0_8_ = SVar327.values.values._8_8_;
                auVar264._8_56_ = auVar189;
                auVar296 = auVar264._0_16_;
                auVar152._0_8_ = SVar327.values.values._0_8_;
                auVar152._8_56_ = auVar293;
                auVar297 = auVar152._0_16_;
              }
              else {
                SVar327 = SampledSpectrum::operator-(&sigma_maj);
                auVar252._0_8_ = SVar327.values.values._8_8_;
                auVar252._8_56_ = auVar189;
                auVar142._0_8_ = SVar327.values.values._0_8_;
                auVar142._8_56_ = auVar293;
                d.values.values = (array<float,_4>)vmovlhps_avx(auVar142._0_16_,auVar252._0_16_);
                auVar293 = (undefined1  [56])0x0;
                SVar327 = SampledSpectrum::operator*(&d,local_708 - (float)local_7c8._0_4_);
                auVar253._0_8_ = SVar327.values.values._8_8_;
                auVar253._8_56_ = auVar189;
                auVar143._0_8_ = SVar327.values.values._0_8_;
                auVar143._8_56_ = auVar293;
                _bssrdf = (array<float,_4>)vmovlhps_avx(auVar143._0_16_,auVar253._0_16_);
                auVar293 = ZEXT856(bssrdf._8_8_);
                SVar327 = FastExp((SampledSpectrum *)&bssrdf);
                auVar254._0_8_ = SVar327.values.values._8_8_;
                auVar254._8_56_ = auVar189;
                auVar296 = auVar254._0_16_;
                auVar144._0_8_ = SVar327.values.values._0_8_;
                auVar144._8_56_ = auVar293;
                auVar297 = auVar144._0_16_;
              }
              auVar297 = vmovlhps_avx(auVar297,auVar296);
              rrBeta.values.values._0_8_ = auVar297._0_8_;
              rrBeta.values.values[2] = auVar297._8_4_;
              rrBeta.values.values[3] = auVar297._12_4_;
              SampledSpectrum::operator*=(&TmajAccum,&rrBeta);
              if ((tMax < fVar294) ||
                 (iVar38 = voxel[iVar53], voxel[iVar53] = iVar38 + step[iVar53],
                 iVar38 + step[iVar53] == voxelLimit[iVar53])) break;
              local_7c8._0_4_ = local_708;
              nextCrossingT[iVar53] = fVar294 + deltaT[iVar53];
              uVar50 = (ulong)(uint)pDVar3->lambda_min;
              iVar38 = *piVar2;
            }
LAB_003cd26e:
            goto LAB_003cd27f;
          }
          SampledSpectrum::SampledSpectrum(&rrBeta,1.0);
        }
LAB_003cd290:
        auVar79._8_8_ = 0;
        auVar79._0_4_ = rrBeta.values.values[0];
        auVar79._4_4_ = rrBeta.values.values[1];
        auVar198 = ZEXT864(CONCAT44(rrBeta.values.values[3],rrBeta.values.values[2]));
      }
      pRStack_5e0 = &rng;
      pSStack_5f0 = &L;
      IStack_600 = (Interval)&depth;
      local_608 = (Interval)&lightPathPDF;
      local_610 = &uniPathPDF;
      auVar63 = auVar321._0_16_;
      auVar296 = auVar315._0_16_;
      auVar297 = auVar303._0_16_;
      auVar190 = auVar198._0_16_;
      Tmaj.values.values = (array<float,_4>)vmovlhps_avx(auVar79,auVar190);
      auVar153 = ZEXT1664((undefined1  [16])Tmaj.values.values);
      uVar51 = 1;
      IStack_5f8 = (Interval)this;
      if ((terminated == false) && (uVar51 = 0, scattered != true)) {
        SampledSpectrum::operator*=(&T_hat,&Tmaj);
        SampledSpectrum::operator*=(&uniPathPDF,&Tmaj);
        SampledSpectrum::operator*=(&lightPathPDF,&Tmaj);
        goto LAB_003cd303;
      }
    }
    auVar198 = ZEXT1664(auVar190);
    in_ZMM4 = ZEXT1664(auVar297);
    in_ZMM6 = ZEXT1664(auVar296);
    in_ZMM7 = ZEXT1664(auVar63);
    pstd::optional<pbrt::ShapeIntersection>::~optional(&si);
    if ((uVar51 & 1) != 0) {
      return (SampledSpectrum)(undefined1  [16])L.values.values;
    }
  } while( true );
}

Assistant:

SampledSpectrum VolPathIntegrator::Li(RayDifferential ray, SampledWavelengths &lambda,
                                      SamplerHandle sampler, ScratchBuffer &scratchBuffer,
                                      VisibleSurface *visibleSurf) const {
    // Declare state variables for volumetric path
    SampledSpectrum L(0.f), T_hat(1.f), uniPathPDF(1.f), lightPathPDF(1.f);
    bool specularBounce = false, anyNonSpecularBounces = false;
    int depth = 0;

    LightSampleContext prevIntrContext;

    Float etaScale = 1;

    while (true) {
        // Sample segment of volumetric scattering path
        PBRT_DBG("%s\n",
                 StringPrintf("Path tracer depth %d, current L = %s, T_hat = %s\n", depth,
                              L, T_hat)
                     .c_str());
        pstd::optional<ShapeIntersection> si = Intersect(ray);
        if (ray.medium) {
            // Sample the participating medium
            bool scattered = false, terminated = false;
            Float tMax = si ? si->tHit : Infinity;
            uint64_t hash0 = Hash(sampler.Get1D());
            uint64_t hash1 = Hash(sampler.Get1D());
            RNG rng(hash0, hash1);
            SampledSpectrum Tmaj = ray.medium.SampleTmaj(
                ray, tMax, sampler.Get1D(), rng, lambda,
                [&](const MediumSample &mediumSample) {
                    // Handle medium scattering event for ray
                    if (!T_hat) {
                        terminated = true;
                        return false;
                    }
                    ++volumeInteractions;
                    const MediumInteraction &intr = mediumSample.intr;
                    const SampledSpectrum &sigma_a = intr.sigma_a,
                                          &sigma_s = intr.sigma_s;
                    const SampledSpectrum &Tmaj = mediumSample.Tmaj;
                    // Rescale path throughput and PDFs if necessary
                    Rescale(T_hat, uniPathPDF, lightPathPDF);

                    // Add emission from medium scattering event
                    if (depth < maxDepth && intr.Le) {
                        // Compute $\hat{P}$ at new path vertex
                        SampledSpectrum P_hat = T_hat * Tmaj * sigma_a * intr.Le;

                        // Compute PDF for absorption event at path vertex
                        SampledSpectrum emitPDF = uniPathPDF * intr.sigma_maj * Tmaj;

                        // Update _L_ for medium emission
                        L += SafeDiv(P_hat, emitPDF.Average() * lambda.PDF());
                    }

                    // Compute medium event probabilities for interaction
                    Float pAbsorb = intr.sigma_a[0] / intr.sigma_maj[0];
                    Float pScatter = intr.sigma_s[0] / intr.sigma_maj[0];
                    Float pNull = std::max<Float>(0, 1 - pAbsorb - pScatter);

                    CHECK_GE(1 - pAbsorb - pScatter, -1e-6);
                    // Sample medium scattering event type and update path
                    Float um = rng.Uniform<Float>();
                    int mode = SampleDiscrete({pAbsorb, pScatter, pNull}, um);
                    if (mode == 0) {
                        // Handle absorption along ray path
                        terminated = true;
                        return false;

                    } else if (mode == 1) {
                        // Handle scattering along ray path
                        if (depth++ >= maxDepth) {
                            terminated = true;
                            return false;
                        }
                        T_hat *= Tmaj * sigma_s;
                        uniPathPDF *= Tmaj * sigma_s;
                        // Sample direct lighting at volume scattering event
                        L += SafeDiv(
                            SampleLd(intr, nullptr, lambda, sampler, T_hat, uniPathPDF),
                            lambda.PDF());

                        // Sample new direction at real scattering event
                        Point2f u = sampler.Get2D();
                        pstd::optional<PhaseFunctionSample> ps =
                            intr.phase.Sample_p(-ray.d, u);
                        if (!ps || ps->pdf == 0) {
                            terminated = true;
                            return false;
                        }
                        // Update ray path state for indirect volume scattering
                        T_hat *= ps->p;
                        lightPathPDF = uniPathPDF;
                        uniPathPDF *= ps->pdf;
                        prevIntrContext = LightSampleContext(intr);
                        scattered = true;
                        ray = intr.SpawnRay(ps->wi);
                        specularBounce = false;
                        anyNonSpecularBounces = true;

                        return false;

                    } else {
                        // Handle null scattering along ray path
                        SampledSpectrum sigma_n = intr.sigma_n();
                        T_hat *= Tmaj * sigma_n;
                        uniPathPDF *= Tmaj * sigma_n;
                        lightPathPDF *= Tmaj * intr.sigma_maj;
                        Rescale(T_hat, uniPathPDF, lightPathPDF);
                        return true;
                    }
                });
            // Handle terminated, scattered, and unscattered rays after medium sampling
            if (terminated)
                return L;
            if (scattered)
                continue;
            T_hat *= Tmaj;
            uniPathPDF *= Tmaj;
            lightPathPDF *= Tmaj;
        }
        // Handle surviving unscattered rays
        // Add emitted light at volume path vertex or from the environment
        if (!si) {
            // Accumulate contributions from infinite light sources
            for (const auto &light : infiniteLights) {
                if (SampledSpectrum Le = light.Le(ray, lambda); Le) {
                    if (depth == 0 || specularBounce)
                        L += SafeDiv(T_hat * Le, uniPathPDF.Average() * lambda.PDF());
                    else {
                        // Add infinite light contribution using both PDFs with MIS
                        Float lightPDF = lightSampler.PDF(prevIntrContext, light) *
                                         light.PDF_Li(prevIntrContext, ray.d,
                                                      LightSamplingMode::WithMIS);
                        lightPathPDF *= lightPDF;
                        L += SafeDiv(T_hat * Le, (uniPathPDF + lightPathPDF).Average() *
                                                     lambda.PDF());
                    }
                }
            }

            break;
        }
        SurfaceInteraction &isect = si->intr;
        if (SampledSpectrum Le = isect.Le(-ray.d, lambda); Le) {
            // Add contribution of emission from intersected surface
            if (depth == 0 || specularBounce)
                L += SafeDiv(T_hat * Le, uniPathPDF.Average() * lambda.PDF());
            else {
                // Add surface light contribution using both PDFs with MIS
                LightHandle areaLight(isect.areaLight);
                Float lightPDF =
                    lightSampler.PDF(prevIntrContext, areaLight) *
                    areaLight.PDF_Li(prevIntrContext, ray.d, LightSamplingMode::WithMIS);
                lightPathPDF *= lightPDF;
                L += SafeDiv(T_hat * Le,
                             (uniPathPDF + lightPathPDF).Average() * lambda.PDF());
            }
        }

        // Get BSDF and skip over medium boundaries
        BSDF bsdf = isect.GetBSDF(ray, lambda, camera, scratchBuffer, sampler);
        if (!bsdf) {
            isect.SkipIntersection(&ray, si->tHit);
            continue;
        }

        // Initialize _visibleSurf_ at first intersection
        if (depth == 0 && visibleSurf != nullptr) {
            // Estimate BSDF's albedo
            constexpr int nRhoSamples = 16;
            SampledSpectrum rho(0.f);
            for (int i = 0; i < nRhoSamples; ++i) {
                // Generate sample for hemispherical-directional reflectance
                Float uc = RadicalInverse(0, i + 1);
                Point2f u(RadicalInverse(1, i + 1), RadicalInverse(2, i + 1));

                // Estimate one term of $\rho_\roman{hd}$
                pstd::optional<BSDFSample> bs = bsdf.Sample_f(si->intr.wo, uc, u);
                if (bs)
                    rho += bs->f * AbsDot(bs->wi, si->intr.shading.n) / bs->pdf;
            }
            SampledSpectrum albedo = rho / nRhoSamples;

            *visibleSurf =
                VisibleSurface(si->intr, camera.GetCameraTransform(), albedo, lambda);
        }

        // Terminate path if maximum depth reached
        if (depth++ >= maxDepth)
            return L;

        ++surfaceInteractions;
        // Possibly regularize the BSDF
        if (regularize && anyNonSpecularBounces) {
            ++regularizedBSDFs;
            bsdf.Regularize();
        }

        // Sample illumination from lights to find attenuated path contribution
        if (bsdf.IsNonSpecular()) {
            L += SafeDiv(SampleLd(isect, &bsdf, lambda, sampler, T_hat, uniPathPDF),
                         lambda.PDF());
            DCHECK(IsInf(L.y(lambda)) == false);
        }
        prevIntrContext = LightSampleContext(isect);

        // Sample BSDF to get new volumetric path direction
        Vector3f wo = -ray.d;
        Float u = sampler.Get1D();
        pstd::optional<BSDFSample> bs = bsdf.Sample_f(wo, u, sampler.Get2D());
        if (!bs)
            break;
        // Update _T_hat_ and PDFs for BSDF scattering
        T_hat *= bs->f * AbsDot(bs->wi, isect.shading.n);
        lightPathPDF = uniPathPDF;
        if (bs->pdfIsProportional) {
            Float pdf = bsdf.PDF(wo, bs->wi);
            T_hat *= pdf / bs->pdf;
            uniPathPDF *= pdf;
        } else
            uniPathPDF *= bs->pdf;
        Rescale(T_hat, uniPathPDF, lightPathPDF);

        PBRT_DBG("%s\n", StringPrintf("Sampled BSDF, f = %s, pdf = %f -> T_hat = %s",
                                      bs->f, bs->pdf, T_hat)
                             .c_str());
        DCHECK(IsInf(T_hat.y(lambda)) == false);
        specularBounce = bs->IsSpecular();
        anyNonSpecularBounces |= !bs->IsSpecular();
        if (bs->IsTransmission())
            etaScale *= Sqr(bs->eta);
        ray = isect.SpawnRay(ray, bsdf, bs->wi, bs->flags, bs->eta);

        // Account for attenuated subsurface scattering, if applicable
        BSSRDFHandle bssrdf = isect.GetBSSRDF(ray, lambda, camera, scratchBuffer);
        if (bssrdf && bs->IsTransmission()) {
            // Sample BSSRDF probe segment to find exit point
            Float uc = sampler.Get1D();
            Point2f up = sampler.Get2D();
            pstd::optional<BSSRDFProbeSegment> probeSeg = bssrdf.SampleSp(uc, up);
            if (!probeSeg)
                break;

            // Sample random intersection along BSSRDF probe segment
            uint64_t seed = MixBits(FloatToBits(sampler.Get1D()));
            WeightedReservoirSampler<SubsurfaceInteraction> interactionSampler(seed);
            // Intersect BSSRDF sampling ray against the scene geometry
            Interaction base(probeSeg->p0, ray.time, (MediumHandle) nullptr);
            while (true) {
                Ray r = base.SpawnRayTo(probeSeg->p1);
                if (r.d == Vector3f(0, 0, 0))
                    break;
                pstd::optional<ShapeIntersection> si = Intersect(r, 1);
                if (!si)
                    break;
                base = si->intr;
                if (si->intr.material == isect.material)
                    interactionSampler.Add(SubsurfaceInteraction(si->intr), 1.f);
            }

            if (!interactionSampler.HasSample())
                break;

            // Convert probe intersection to _BSSRDFSample_ and update _beta_
            SubsurfaceInteraction ssi = interactionSampler.GetSample();
            BSSRDFSample bssrdfSample =
                bssrdf.ProbeIntersectionToSample(ssi, scratchBuffer);
            if (!bssrdfSample.Sp || bssrdfSample.pdf == 0)
                break;
            T_hat *= bssrdfSample.Sp * interactionSampler.WeightSum() / bssrdfSample.pdf;
            SurfaceInteraction pi = ssi;
            BSDF &Sw = bssrdfSample.Sw;
            pi.wo = bssrdfSample.wo;

            // Possibly regularize subsurface BSDF and update _prevIntrContext_
            anyNonSpecularBounces = true;
            if (regularize) {
                ++regularizedBSDFs;
                Sw.Regularize();
            } else
                ++totalBSDFs;
            prevIntrContext = LightSampleContext(pi);

            // Account for attenuated direct subsurface scattering
            L += SafeDiv(SampleLd(pi, &Sw, lambda, sampler, T_hat, uniPathPDF),
                         lambda.PDF());

            // Sample ray for indirect subsurface scattering
            Float u = sampler.Get1D();
            pstd::optional<BSDFSample> bs = Sw.Sample_f(pi.wo, u, sampler.Get2D());
            if (!bs)
                break;
            T_hat *= bs->f * AbsDot(bs->wi, pi.shading.n);
            lightPathPDF = uniPathPDF;
            uniPathPDF *= bs->pdf;
            // Don't increment depth this time...
            DCHECK(!IsInf(T_hat.y(lambda)));
            specularBounce = bs->IsSpecular();
            ray = RayDifferential(pi.SpawnRay(bs->wi));
        }

        // Possibly terminate volumetric path with Russian roulette
        if (!T_hat)
            break;
        SampledSpectrum rrBeta = T_hat * etaScale / uniPathPDF.Average();
        PBRT_DBG("%s\n",
                 StringPrintf("etaScale %f -> rrBeta %s", etaScale, rrBeta).c_str());
        if (rrBeta.MaxComponentValue() < 1 && depth > 1) {
            Float q = std::max<Float>(0, 1 - rrBeta.MaxComponentValue());
            if (sampler.Get1D() < q)
                break;
            uniPathPDF *= 1 - q;
            lightPathPDF *= 1 - q;
        }
    }
    return L;
}